

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse2::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float fVar15;
  undefined4 uVar16;
  int iVar17;
  ulong uVar18;
  Geometry *pGVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [14];
  undefined1 auVar35 [15];
  undefined1 auVar36 [14];
  undefined1 auVar37 [15];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [14];
  undefined1 auVar41 [15];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [14];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [14];
  undefined1 auVar61 [15];
  undefined1 auVar62 [14];
  undefined1 auVar63 [15];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [14];
  undefined1 auVar67 [15];
  undefined1 auVar68 [14];
  undefined1 auVar69 [15];
  undefined1 auVar70 [14];
  undefined1 auVar71 [14];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [13];
  undefined1 auVar85 [13];
  undefined1 auVar86 [13];
  undefined1 auVar87 [13];
  undefined1 auVar88 [13];
  undefined1 auVar89 [13];
  undefined1 auVar90 [13];
  undefined1 auVar91 [13];
  undefined1 auVar92 [13];
  undefined1 auVar93 [13];
  undefined1 auVar94 [13];
  undefined1 auVar95 [13];
  undefined1 auVar96 [13];
  undefined1 auVar97 [13];
  undefined1 auVar98 [13];
  undefined1 auVar99 [13];
  undefined1 auVar100 [13];
  undefined1 auVar101 [13];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [16];
  undefined1 auVar115 [15];
  unkuint9 Var116;
  undefined1 auVar117 [11];
  undefined1 auVar118 [14];
  undefined1 auVar119 [15];
  undefined1 auVar120 [11];
  undefined1 auVar121 [14];
  undefined1 auVar122 [13];
  undefined1 auVar123 [13];
  undefined1 auVar124 [15];
  undefined1 auVar125 [11];
  undefined1 auVar126 [14];
  undefined1 auVar127 [15];
  undefined1 auVar128 [11];
  undefined1 auVar129 [14];
  undefined1 auVar130 [13];
  undefined1 auVar131 [13];
  undefined1 auVar132 [15];
  undefined1 auVar133 [11];
  undefined1 auVar134 [14];
  undefined1 auVar135 [15];
  undefined1 auVar136 [11];
  undefined1 auVar137 [14];
  undefined1 auVar138 [13];
  undefined1 auVar139 [13];
  undefined1 auVar140 [14];
  undefined1 auVar141 [12];
  unkbyte10 Var142;
  undefined1 auVar143 [14];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  uint6 uVar156;
  uint6 uVar157;
  uint6 uVar158;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar159;
  int iVar160;
  undefined4 uVar161;
  undefined4 uVar162;
  long lVar163;
  long lVar164;
  undefined4 uVar167;
  RTCRayN *pRVar165;
  RTCFilterFunctionN p_Var166;
  ulong uVar168;
  long lVar169;
  uint uVar170;
  long lVar171;
  ulong uVar172;
  ulong uVar173;
  ulong uVar174;
  ulong uVar175;
  long lVar176;
  ulong uVar177;
  long lVar178;
  long lVar179;
  ulong uVar180;
  long lVar181;
  uint uVar182;
  uint uVar183;
  uint uVar184;
  uint uVar185;
  uint uVar186;
  uint uVar187;
  uint uVar188;
  uint uVar189;
  uint uVar190;
  uint uVar191;
  uint uVar192;
  uint uVar193;
  byte bVar194;
  char cVar195;
  byte bVar220;
  byte bVar222;
  byte bVar224;
  char cVar226;
  char cVar228;
  char cVar230;
  char cVar233;
  float extraout_XMM0_Dc;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  char cVar221;
  char cVar223;
  char cVar225;
  char cVar227;
  char cVar229;
  char cVar231;
  char cVar234;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float extraout_XMM0_Dd;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar217;
  undefined1 auVar218 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar219;
  float fVar235;
  float fVar236;
  float fVar261;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar262;
  float fVar283;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar284;
  float fVar302;
  float fVar303;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar332;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar333;
  float fVar334;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar344;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  UVIdentity<4> mapUV;
  undefined1 local_14d8 [8];
  float fStack_14d0;
  float fStack_14cc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined4 uStack_148c;
  undefined1 local_1488 [8];
  undefined8 uStack_1480;
  float local_1458;
  float fStack_1454;
  float fStack_143c;
  undefined8 local_1438;
  undefined8 uStack_1430;
  vbool<4> valid;
  undefined1 local_1418 [16];
  ulong local_1400;
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<4>_> *local_1388;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  vint<4> sy;
  vfloat<4> tNear;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8 [4];
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float local_1288 [4];
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1258;
  float fStack_1250;
  float fStack_124c;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined8 local_1238;
  ulong local_1230;
  ulong local_1228;
  ulong local_1220;
  ulong local_1218;
  long local_1210;
  long local_1208;
  RayHitK<4> *local_1200;
  Scene *local_11f8;
  ulong local_11f0;
  ulong local_11e8;
  ulong local_11e0;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  vint<4> sx;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  uint local_1108;
  uint uStack_1104;
  uint uStack_1100;
  uint uStack_10fc;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined2 uVar232;
  
  local_1388 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar332 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar343 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar15 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar344 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar375 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar380 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar391 = fVar344 * 0.99999964;
  fVar349 = fVar375 * 0.99999964;
  fVar386 = fVar380 * 0.99999964;
  fVar344 = fVar344 * 1.0000004;
  fVar375 = fVar375 * 1.0000004;
  fVar380 = fVar380 * 1.0000004;
  uVar174 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar175 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar180 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar177 = uVar174 ^ 0x10;
  uVar172 = uVar175 ^ 0x10;
  local_11e0 = uVar180 ^ 0x10;
  iVar160 = (tray->tnear).field_0.i[k];
  auVar241._4_4_ = iVar160;
  auVar241._0_4_ = iVar160;
  auVar241._8_4_ = iVar160;
  auVar241._12_4_ = iVar160;
  iVar160 = (tray->tfar).field_0.i[k];
  local_10e8._4_4_ = iVar160;
  local_10e8._0_4_ = iVar160;
  local_10e8._8_4_ = iVar160;
  local_10e8._12_4_ = iVar160;
  lVar163 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1268 = fVar332;
  fStack_1264 = fVar332;
  fStack_1260 = fVar332;
  fStack_125c = fVar332;
  local_1278 = fVar343;
  fStack_1274 = fVar343;
  fStack_1270 = fVar343;
  fStack_126c = fVar343;
  local_1200 = ray;
  local_11d8 = fVar344;
  fStack_11d4 = fVar344;
  fStack_11d0 = fVar344;
  fStack_11cc = fVar344;
  local_10a8 = fVar375;
  fStack_10a4 = fVar375;
  fStack_10a0 = fVar375;
  fStack_109c = fVar375;
  local_10b8 = fVar380;
  fStack_10b4 = fVar380;
  fStack_10b0 = fVar380;
  fStack_10ac = fVar380;
  local_10c8 = fVar386;
  fStack_10c4 = fVar386;
  fStack_10c0 = fVar386;
  fStack_10bc = fVar386;
  local_10d8 = fVar391;
  fStack_10d4 = fVar391;
  fStack_10d0 = fVar391;
  fStack_10cc = fVar391;
  local_1198 = fVar349;
  fStack_1194 = fVar349;
  fStack_1190 = fVar349;
  fStack_118c = fVar349;
  local_1218 = uVar174;
  local_1220 = uVar175;
  local_1228 = uVar180;
  local_1230 = uVar177;
  local_1238 = uVar172;
  local_11a8 = auVar241;
  fVar236 = fVar375;
  fVar396 = fVar375;
  fVar261 = fVar375;
  fVar262 = fVar349;
  fVar333 = fVar349;
  fVar334 = fVar349;
  fVar284 = fVar332;
  fVar359 = fVar332;
  fVar303 = fVar332;
  fVar305 = fVar343;
  fVar368 = fVar343;
  fVar235 = fVar343;
  fVar338 = fVar344;
  fVar339 = fVar344;
  fVar340 = fVar344;
  fVar283 = fVar380;
  fVar384 = fVar380;
  fVar369 = fVar380;
  fVar372 = fVar386;
  fVar373 = fVar386;
  fVar374 = fVar386;
  fVar302 = fVar391;
  fVar304 = fVar391;
  fVar306 = fVar391;
LAB_0020efd5:
  do {
    pSVar159 = local_1388 + -1;
    local_1388 = local_1388 + -1;
    if ((float)pSVar159->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar159->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar173 = (local_1388->ptr).ptr;
      while ((uVar173 & 8) == 0) {
        uVar168 = uVar173 & 0xfffffffffffffff0;
        fVar341 = *(float *)(ray + k * 4 + 0x70);
        pfVar14 = (float *)(uVar168 + 0x80 + uVar174);
        pfVar13 = (float *)(uVar168 + 0x20 + uVar174);
        auVar307._0_4_ = ((*pfVar14 * fVar341 + *pfVar13) - fVar332) * fVar391;
        auVar307._4_4_ = ((pfVar14[1] * fVar341 + pfVar13[1]) - fVar284) * fVar302;
        auVar307._8_4_ = ((pfVar14[2] * fVar341 + pfVar13[2]) - fVar359) * fVar304;
        auVar307._12_4_ = ((pfVar14[3] * fVar341 + pfVar13[3]) - fVar303) * fVar306;
        pfVar14 = (float *)(uVar168 + 0x80 + uVar175);
        pfVar13 = (float *)(uVar168 + 0x20 + uVar175);
        auVar289._0_4_ = ((*pfVar14 * fVar341 + *pfVar13) - fVar343) * fVar349;
        auVar289._4_4_ = ((pfVar14[1] * fVar341 + pfVar13[1]) - fVar305) * fVar262;
        auVar289._8_4_ = ((pfVar14[2] * fVar341 + pfVar13[2]) - fVar368) * fVar333;
        auVar289._12_4_ = ((pfVar14[3] * fVar341 + pfVar13[3]) - fVar235) * fVar334;
        pfVar14 = (float *)(uVar168 + 0x80 + uVar180);
        pfVar13 = (float *)(uVar168 + 0x20 + uVar180);
        auVar237._0_4_ = ((*pfVar14 * fVar341 + *pfVar13) - fVar15) * fVar386;
        auVar237._4_4_ = ((pfVar14[1] * fVar341 + pfVar13[1]) - fVar15) * fVar372;
        auVar237._8_4_ = ((pfVar14[2] * fVar341 + pfVar13[2]) - fVar15) * fVar373;
        auVar237._12_4_ = ((pfVar14[3] * fVar341 + pfVar13[3]) - fVar15) * fVar374;
        auVar285 = maxps(auVar289,auVar237);
        auVar237 = maxps(auVar241,auVar307);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar237,auVar285);
        pfVar14 = (float *)(uVar168 + 0x80 + uVar177);
        pfVar13 = (float *)(uVar168 + 0x20 + uVar177);
        auVar309._0_4_ = ((*pfVar14 * fVar341 + *pfVar13) - fVar332) * fVar344;
        auVar309._4_4_ = ((pfVar14[1] * fVar341 + pfVar13[1]) - fVar284) * fVar338;
        auVar309._8_4_ = ((pfVar14[2] * fVar341 + pfVar13[2]) - fVar359) * fVar339;
        auVar309._12_4_ = ((pfVar14[3] * fVar341 + pfVar13[3]) - fVar303) * fVar340;
        pfVar14 = (float *)(uVar168 + 0x80 + uVar172);
        pfVar13 = (float *)(uVar168 + 0x20 + uVar172);
        auVar315._0_4_ = ((*pfVar14 * fVar341 + *pfVar13) - fVar343) * fVar375;
        auVar315._4_4_ = ((pfVar14[1] * fVar341 + pfVar13[1]) - fVar305) * fVar236;
        auVar315._8_4_ = ((pfVar14[2] * fVar341 + pfVar13[2]) - fVar368) * fVar396;
        auVar315._12_4_ = ((pfVar14[3] * fVar341 + pfVar13[3]) - fVar235) * fVar261;
        pfVar14 = (float *)(uVar168 + 0x80 + local_11e0);
        pfVar13 = (float *)(uVar168 + 0x20 + local_11e0);
        auVar285._0_4_ = ((*pfVar14 * fVar341 + *pfVar13) - fVar15) * fVar380;
        auVar285._4_4_ = ((pfVar14[1] * fVar341 + pfVar13[1]) - fVar15) * fVar283;
        auVar285._8_4_ = ((pfVar14[2] * fVar341 + pfVar13[2]) - fVar15) * fVar384;
        auVar285._12_4_ = ((pfVar14[3] * fVar341 + pfVar13[3]) - fVar15) * fVar369;
        auVar307 = minps(auVar315,auVar285);
        auVar237 = minps(local_10e8,auVar309);
        auVar237 = minps(auVar237,auVar307);
        if (((uint)uVar173 & 7) == 6) {
          bVar25 = (fVar341 < *(float *)(uVar168 + 0xf0) && *(float *)(uVar168 + 0xe0) <= fVar341)
                   && tNear.field_0._0_4_ <= auVar237._0_4_;
          bVar26 = (fVar341 < *(float *)(uVar168 + 0xf4) && *(float *)(uVar168 + 0xe4) <= fVar341)
                   && tNear.field_0._4_4_ <= auVar237._4_4_;
          bVar27 = (fVar341 < *(float *)(uVar168 + 0xf8) && *(float *)(uVar168 + 0xe8) <= fVar341)
                   && tNear.field_0._8_4_ <= auVar237._8_4_;
          bVar28 = (fVar341 < *(float *)(uVar168 + 0xfc) && *(float *)(uVar168 + 0xec) <= fVar341)
                   && tNear.field_0._12_4_ <= auVar237._12_4_;
        }
        else {
          bVar25 = tNear.field_0._0_4_ <= auVar237._0_4_;
          bVar26 = tNear.field_0._4_4_ <= auVar237._4_4_;
          bVar27 = tNear.field_0._8_4_ <= auVar237._8_4_;
          bVar28 = tNear.field_0._12_4_ <= auVar237._12_4_;
        }
        auVar196._0_4_ = (uint)bVar25 * -0x80000000;
        auVar196._4_4_ = (uint)bVar26 * -0x80000000;
        auVar196._8_4_ = (uint)bVar27 * -0x80000000;
        auVar196._12_4_ = (uint)bVar28 * -0x80000000;
        uVar170 = movmskps((int)local_11e0,auVar196);
        if (uVar170 == 0) {
          if (local_1388 == stack) {
            return;
          }
          goto LAB_0020efd5;
        }
        uVar170 = uVar170 & 0xff;
        lVar164 = 0;
        if (uVar170 != 0) {
          for (; (uVar170 >> lVar164 & 1) == 0; lVar164 = lVar164 + 1) {
          }
        }
        uVar18 = *(ulong *)(uVar168 + lVar164 * 8);
        uVar170 = uVar170 - 1 & uVar170;
        uVar173 = uVar18;
        if (uVar170 != 0) {
          uVar182 = tNear.field_0.i[lVar164];
          lVar164 = 0;
          if (uVar170 != 0) {
            for (; (uVar170 >> lVar164 & 1) == 0; lVar164 = lVar164 + 1) {
            }
          }
          uVar173 = *(ulong *)(uVar168 + lVar164 * 8);
          uVar183 = tNear.field_0.i[lVar164];
          uVar170 = uVar170 - 1 & uVar170;
          if (uVar170 == 0) {
            if (uVar182 < uVar183) {
              (local_1388->ptr).ptr = uVar173;
              local_1388->dist = uVar183;
              local_1388 = local_1388 + 1;
              uVar173 = uVar18;
            }
            else {
              (local_1388->ptr).ptr = uVar18;
              local_1388->dist = uVar182;
              local_1388 = local_1388 + 1;
            }
          }
          else {
            auVar197._8_4_ = uVar182;
            auVar197._0_8_ = uVar18;
            auVar197._12_4_ = 0;
            auVar238._8_4_ = uVar183;
            auVar238._0_8_ = uVar173;
            auVar238._12_4_ = 0;
            lVar164 = 0;
            if (uVar170 != 0) {
              for (; (uVar170 >> lVar164 & 1) == 0; lVar164 = lVar164 + 1) {
              }
            }
            uVar173 = *(ulong *)(uVar168 + lVar164 * 8);
            iVar160 = tNear.field_0.i[lVar164];
            auVar263._8_4_ = iVar160;
            auVar263._0_8_ = uVar173;
            auVar263._12_4_ = 0;
            auVar286._8_4_ = -(uint)((int)uVar182 < (int)uVar183);
            uVar170 = uVar170 - 1 & uVar170;
            if (uVar170 == 0) {
              auVar286._4_4_ = auVar286._8_4_;
              auVar286._0_4_ = auVar286._8_4_;
              auVar286._12_4_ = auVar286._8_4_;
              auVar237 = auVar197 & auVar286 | ~auVar286 & auVar238;
              auVar307 = auVar238 & auVar286 | ~auVar286 & auVar197;
              auVar287._8_4_ = -(uint)(auVar237._8_4_ < iVar160);
              auVar287._0_8_ = CONCAT44(auVar287._8_4_,auVar287._8_4_);
              auVar287._12_4_ = auVar287._8_4_;
              auVar285 = auVar263 & auVar287 | ~auVar287 & auVar237;
              auVar198._8_4_ = -(uint)(auVar307._8_4_ < auVar285._8_4_);
              auVar198._4_4_ = auVar198._8_4_;
              auVar198._0_4_ = auVar198._8_4_;
              auVar198._12_4_ = auVar198._8_4_;
              *local_1388 = (StackItemT<embree::NodeRefPtr<4>_>)
                            (~auVar198 & auVar307 | auVar285 & auVar198);
              local_1388[1] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(auVar307 & auVar198 | ~auVar198 & auVar285);
              local_1388 = local_1388 + 2;
              uVar173 = ~auVar287._0_8_ & uVar173 | auVar237._0_8_ & auVar287._0_8_;
            }
            else {
              lVar164 = 0;
              if (uVar170 != 0) {
                for (; (uVar170 >> lVar164 & 1) == 0; lVar164 = lVar164 + 1) {
                }
              }
              iVar17 = tNear.field_0.i[lVar164];
              auVar308._8_4_ = iVar17;
              auVar308._0_8_ = *(undefined8 *)(uVar168 + lVar164 * 8);
              auVar308._12_4_ = 0;
              auVar288._4_4_ = auVar286._8_4_;
              auVar288._0_4_ = auVar286._8_4_;
              auVar288._8_4_ = auVar286._8_4_;
              auVar288._12_4_ = auVar286._8_4_;
              auVar237 = auVar197 & auVar288 | ~auVar288 & auVar238;
              auVar307 = auVar238 & auVar288 | ~auVar288 & auVar197;
              auVar314._0_4_ = -(uint)(iVar160 < iVar17);
              auVar314._4_4_ = -(uint)(iVar160 < iVar17);
              auVar314._8_4_ = -(uint)(iVar160 < iVar17);
              auVar314._12_4_ = -(uint)(iVar160 < iVar17);
              auVar289 = auVar263 & auVar314 | ~auVar314 & auVar308;
              auVar315 = ~auVar314 & auVar263 | auVar308 & auVar314;
              auVar264._8_4_ = -(uint)(auVar307._8_4_ < auVar315._8_4_);
              auVar264._4_4_ = auVar264._8_4_;
              auVar264._0_4_ = auVar264._8_4_;
              auVar264._12_4_ = auVar264._8_4_;
              auVar309 = auVar307 & auVar264 | ~auVar264 & auVar315;
              auVar239._8_4_ = -(uint)(auVar237._8_4_ < auVar289._8_4_);
              auVar239._0_8_ = CONCAT44(auVar239._8_4_,auVar239._8_4_);
              auVar239._12_4_ = auVar239._8_4_;
              auVar285 = ~auVar239 & auVar237 | auVar289 & auVar239;
              auVar199._8_4_ = -(uint)(auVar285._8_4_ < auVar309._8_4_);
              auVar199._4_4_ = auVar199._8_4_;
              auVar199._0_4_ = auVar199._8_4_;
              auVar199._12_4_ = auVar199._8_4_;
              *local_1388 = (StackItemT<embree::NodeRefPtr<4>_>)
                            (~auVar264 & auVar307 | auVar315 & auVar264);
              local_1388[1] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(~auVar199 & auVar285 | auVar309 & auVar199);
              local_1388[2] =
                   (StackItemT<embree::NodeRefPtr<4>_>)(auVar285 & auVar199 | ~auVar199 & auVar309);
              local_1388 = local_1388 + 3;
              uVar173 = auVar237._0_8_ & auVar239._0_8_ | ~auVar239._0_8_ & auVar289._0_8_;
              fVar332 = local_1268;
              fVar284 = fStack_1264;
              fVar359 = fStack_1260;
              fVar303 = fStack_125c;
              fVar343 = local_1278;
              fVar305 = fStack_1274;
              fVar368 = fStack_1270;
              fVar235 = fStack_126c;
            }
          }
        }
      }
      local_1210 = (ulong)((uint)uVar173 & 0xf) - 8;
      if (local_1210 != 0) {
        uVar173 = uVar173 & 0xfffffffffffffff0;
        local_1208 = 0;
        do {
          lVar164 = local_1208 * 0x90;
          fVar262 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar173 + 0x80 + lVar164)) *
                    *(float *)(uVar173 + 0x84 + lVar164);
          uVar161 = *(undefined4 *)(uVar173 + 0x24 + lVar164);
          auVar241 = *(undefined1 (*) [16])(uVar173 + 0x20 + lVar164);
          auVar237 = *(undefined1 (*) [16])(uVar173 + 0x30 + lVar164);
          bVar29 = (byte)uVar161;
          bVar194 = auVar241[0];
          bVar30 = (byte)((uint)uVar161 >> 8);
          bVar220 = auVar241[1];
          bVar31 = (byte)((uint)uVar161 >> 0x10);
          bVar222 = auVar241[2];
          bVar32 = (byte)((uint)uVar161 >> 0x18);
          bVar224 = auVar241[3];
          cVar226 = auVar241[4];
          cVar228 = auVar241[5];
          cVar230 = auVar241[6];
          cVar233 = auVar241[7];
          cVar195 = -((byte)((bVar29 < bVar194) * bVar29 | (bVar29 >= bVar194) * bVar194) == bVar194
                     );
          cVar221 = -((byte)((bVar30 < bVar220) * bVar30 | (bVar30 >= bVar220) * bVar220) == bVar220
                     );
          cVar223 = -((byte)((bVar31 < bVar222) * bVar31 | (bVar31 >= bVar222) * bVar222) == bVar222
                     );
          cVar225 = -((byte)((bVar32 < bVar224) * bVar32 | (bVar32 >= bVar224) * bVar224) == bVar224
                     );
          cVar227 = -((char)((cVar226 == '\0') * cVar226) == cVar226);
          cVar229 = -((char)((cVar228 == '\0') * cVar228) == cVar228);
          cVar231 = -((char)((cVar230 == '\0') * cVar230) == cVar230);
          cVar234 = -((char)((cVar233 == '\0') * cVar233) == cVar233);
          auVar33[0xd] = 0;
          auVar33._0_13_ = auVar241._0_13_;
          auVar33[0xe] = cVar233;
          auVar46[0xc] = cVar230;
          auVar46._0_12_ = auVar241._0_12_;
          auVar46._13_2_ = auVar33._13_2_;
          auVar53[0xb] = 0;
          auVar53._0_11_ = auVar241._0_11_;
          auVar53._12_3_ = auVar46._12_3_;
          auVar59[10] = cVar228;
          auVar59._0_10_ = auVar241._0_10_;
          auVar59._11_4_ = auVar53._11_4_;
          auVar72[9] = 0;
          auVar72._0_9_ = auVar241._0_9_;
          auVar72._10_5_ = auVar59._10_5_;
          auVar78[8] = cVar226;
          auVar78._0_8_ = auVar241._0_8_;
          auVar78._9_6_ = auVar72._9_6_;
          auVar115._7_8_ = 0;
          auVar115._0_7_ = auVar78._8_7_;
          Var116 = CONCAT81(SUB158(auVar115 << 0x40,7),bVar224);
          auVar144._9_6_ = 0;
          auVar144._0_9_ = Var116;
          auVar117._1_10_ = SUB1510(auVar144 << 0x30,5);
          auVar117[0] = bVar222;
          auVar145._11_4_ = 0;
          auVar145._0_11_ = auVar117;
          auVar102[2] = bVar220;
          auVar102._0_2_ = auVar241._0_2_;
          auVar102._3_12_ = SUB1512(auVar145 << 0x20,3);
          auVar108._2_13_ = auVar102._2_13_;
          auVar108._0_2_ = auVar241._0_2_ & 0xff;
          auVar34._10_2_ = 0;
          auVar34._0_10_ = auVar108._0_10_;
          auVar34._12_2_ = (short)Var116;
          uVar156 = CONCAT42(auVar34._10_4_,auVar117._0_2_);
          auVar118._6_8_ = 0;
          auVar118._0_6_ = uVar156;
          auVar60._4_2_ = auVar102._2_2_;
          auVar60._0_4_ = auVar108._0_4_;
          auVar60._6_8_ = SUB148(auVar118 << 0x40,6);
          fVar332 = *(float *)(uVar173 + 0x44 + lVar164);
          fVar343 = *(float *)(uVar173 + 0x38 + lVar164);
          fVar333 = (float)(auVar108._0_4_ & 0xffff) * fVar332 + fVar343;
          fVar338 = (float)auVar60._4_4_ * fVar332 + fVar343;
          fVar340 = (float)(int)uVar156 * fVar332 + fVar343;
          fVar342 = (float)(auVar34._10_4_ >> 0x10) * fVar332 + fVar343;
          auVar241 = *(undefined1 (*) [16])(uVar173 + 0x50 + lVar164);
          auVar35[0xd] = 0;
          auVar35._0_13_ = auVar241._0_13_;
          auVar35[0xe] = auVar241[7];
          auVar47[0xc] = auVar241[6];
          auVar47._0_12_ = auVar241._0_12_;
          auVar47._13_2_ = auVar35._13_2_;
          auVar54[0xb] = 0;
          auVar54._0_11_ = auVar241._0_11_;
          auVar54._12_3_ = auVar47._12_3_;
          auVar61[10] = auVar241[5];
          auVar61._0_10_ = auVar241._0_10_;
          auVar61._11_4_ = auVar54._11_4_;
          auVar73[9] = 0;
          auVar73._0_9_ = auVar241._0_9_;
          auVar73._10_5_ = auVar61._10_5_;
          auVar79[8] = auVar241[4];
          auVar79._0_8_ = auVar241._0_8_;
          auVar79._9_6_ = auVar73._9_6_;
          auVar119._7_8_ = 0;
          auVar119._0_7_ = auVar79._8_7_;
          Var116 = CONCAT81(SUB158(auVar119 << 0x40,7),auVar241[3]);
          auVar146._9_6_ = 0;
          auVar146._0_9_ = Var116;
          auVar120._1_10_ = SUB1510(auVar146 << 0x30,5);
          auVar120[0] = auVar241[2];
          auVar147._11_4_ = 0;
          auVar147._0_11_ = auVar120;
          auVar103[2] = auVar241[1];
          auVar103._0_2_ = auVar241._0_2_;
          auVar103._3_12_ = SUB1512(auVar147 << 0x20,3);
          auVar109._2_13_ = auVar103._2_13_;
          auVar109._0_2_ = auVar241._0_2_ & 0xff;
          auVar36._10_2_ = 0;
          auVar36._0_10_ = auVar109._0_10_;
          auVar36._12_2_ = (short)Var116;
          uVar156 = CONCAT42(auVar36._10_4_,auVar120._0_2_);
          auVar121._6_8_ = 0;
          auVar121._0_6_ = uVar156;
          auVar62._4_2_ = auVar103._2_2_;
          auVar62._0_4_ = auVar109._0_4_;
          auVar62._6_8_ = SUB148(auVar121 << 0x40,6);
          fVar344 = *(float *)(uVar173 + 0x74 + lVar164);
          fVar284 = *(float *)(uVar173 + 0x68 + lVar164);
          uVar172 = (ulong)(ushort)uVar161 & 0xffffffffffff00ff;
          auVar84._8_4_ = 0;
          auVar84._0_8_ = uVar172;
          auVar84[0xc] = bVar32;
          auVar85[8] = bVar31;
          auVar85._0_8_ = uVar172;
          auVar85[9] = 0;
          auVar85._10_3_ = auVar84._10_3_;
          auVar122._5_8_ = 0;
          auVar122._0_5_ = auVar85._8_5_;
          auVar86[4] = bVar30;
          auVar86._0_4_ = (int)uVar172;
          auVar86[5] = 0;
          auVar86._6_7_ = SUB137(auVar122 << 0x40,6);
          fVar334 = (float)(int)uVar172 * fVar332 + fVar343;
          fVar339 = (float)auVar86._4_4_ * fVar332 + fVar343;
          fVar341 = (float)auVar85._8_4_ * fVar332 + fVar343;
          fVar343 = (float)(uint3)(auVar84._10_3_ >> 0x10) * fVar332 + fVar343;
          uVar161 = *(undefined4 *)(uVar173 + 0x54 + lVar164);
          uVar174 = (ulong)(ushort)uVar161 & 0xffffffffffff00ff;
          auVar87._8_4_ = 0;
          auVar87._0_8_ = uVar174;
          auVar87[0xc] = (char)((uint)uVar161 >> 0x18);
          auVar88[8] = (char)((uint)uVar161 >> 0x10);
          auVar88._0_8_ = uVar174;
          auVar88[9] = 0;
          auVar88._10_3_ = auVar87._10_3_;
          auVar123._5_8_ = 0;
          auVar123._0_5_ = auVar88._8_5_;
          auVar89[4] = (char)((uint)uVar161 >> 8);
          auVar89._0_4_ = (int)uVar174;
          auVar89[5] = 0;
          auVar89._6_7_ = SUB137(auVar123 << 0x40,6);
          uVar172 = *(ulong *)(uVar173 + 0x28 + lVar164);
          auVar37._8_6_ = 0;
          auVar37._0_8_ = uVar172;
          auVar37[0xe] = (char)(uVar172 >> 0x38);
          auVar48._8_4_ = 0;
          auVar48._0_8_ = uVar172;
          auVar48[0xc] = (char)(uVar172 >> 0x30);
          auVar48._13_2_ = auVar37._13_2_;
          auVar55._8_4_ = 0;
          auVar55._0_8_ = uVar172;
          auVar55._12_3_ = auVar48._12_3_;
          auVar63._8_2_ = 0;
          auVar63._0_8_ = uVar172;
          auVar63[10] = (char)(uVar172 >> 0x28);
          auVar63._11_4_ = auVar55._11_4_;
          auVar74._8_2_ = 0;
          auVar74._0_8_ = uVar172;
          auVar74._10_5_ = auVar63._10_5_;
          auVar80[8] = (char)(uVar172 >> 0x20);
          auVar80._0_8_ = uVar172;
          auVar80._9_6_ = auVar74._9_6_;
          auVar124._7_8_ = 0;
          auVar124._0_7_ = auVar80._8_7_;
          Var116 = CONCAT81(SUB158(auVar124 << 0x40,7),(char)(uVar172 >> 0x18));
          auVar148._9_6_ = 0;
          auVar148._0_9_ = Var116;
          auVar125._1_10_ = SUB1510(auVar148 << 0x30,5);
          auVar125[0] = (char)(uVar172 >> 0x10);
          auVar149._11_4_ = 0;
          auVar149._0_11_ = auVar125;
          auVar104[2] = (char)(uVar172 >> 8);
          auVar104._0_2_ = (ushort)uVar172;
          auVar104._3_12_ = SUB1512(auVar149 << 0x20,3);
          auVar110._2_13_ = auVar104._2_13_;
          auVar110._0_2_ = (ushort)uVar172 & 0xff;
          auVar38._10_2_ = 0;
          auVar38._0_10_ = auVar110._0_10_;
          auVar38._12_2_ = (short)Var116;
          uVar157 = CONCAT42(auVar38._10_4_,auVar125._0_2_);
          auVar126._6_8_ = 0;
          auVar126._0_6_ = uVar157;
          auVar64._4_2_ = auVar104._2_2_;
          auVar64._0_4_ = auVar110._0_4_;
          auVar64._6_8_ = SUB148(auVar126 << 0x40,6);
          fVar332 = *(float *)(uVar173 + 0x48 + lVar164);
          fVar359 = *(float *)(uVar173 + 0x3c + lVar164);
          fVar350 = (float)(auVar110._0_4_ & 0xffff) * fVar332 + fVar359;
          fVar352 = (float)auVar64._4_4_ * fVar332 + fVar359;
          fVar355 = (float)(int)uVar157 * fVar332 + fVar359;
          fVar358 = (float)(auVar38._10_4_ >> 0x10) * fVar332 + fVar359;
          uVar172 = *(ulong *)(uVar173 + 0x58 + lVar164);
          auVar39._8_6_ = 0;
          auVar39._0_8_ = uVar172;
          auVar39[0xe] = (char)(uVar172 >> 0x38);
          auVar49._8_4_ = 0;
          auVar49._0_8_ = uVar172;
          auVar49[0xc] = (char)(uVar172 >> 0x30);
          auVar49._13_2_ = auVar39._13_2_;
          auVar56._8_4_ = 0;
          auVar56._0_8_ = uVar172;
          auVar56._12_3_ = auVar49._12_3_;
          auVar65._8_2_ = 0;
          auVar65._0_8_ = uVar172;
          auVar65[10] = (char)(uVar172 >> 0x28);
          auVar65._11_4_ = auVar56._11_4_;
          auVar75._8_2_ = 0;
          auVar75._0_8_ = uVar172;
          auVar75._10_5_ = auVar65._10_5_;
          auVar81[8] = (char)(uVar172 >> 0x20);
          auVar81._0_8_ = uVar172;
          auVar81._9_6_ = auVar75._9_6_;
          auVar127._7_8_ = 0;
          auVar127._0_7_ = auVar81._8_7_;
          Var116 = CONCAT81(SUB158(auVar127 << 0x40,7),(char)(uVar172 >> 0x18));
          auVar150._9_6_ = 0;
          auVar150._0_9_ = Var116;
          auVar128._1_10_ = SUB1510(auVar150 << 0x30,5);
          auVar128[0] = (char)(uVar172 >> 0x10);
          auVar151._11_4_ = 0;
          auVar151._0_11_ = auVar128;
          auVar105[2] = (char)(uVar172 >> 8);
          auVar105._0_2_ = (ushort)uVar172;
          auVar105._3_12_ = SUB1512(auVar151 << 0x20,3);
          auVar111._2_13_ = auVar105._2_13_;
          auVar111._0_2_ = (ushort)uVar172 & 0xff;
          auVar40._10_2_ = 0;
          auVar40._0_10_ = auVar111._0_10_;
          auVar40._12_2_ = (short)Var116;
          uVar157 = CONCAT42(auVar40._10_4_,auVar128._0_2_);
          auVar129._6_8_ = 0;
          auVar129._0_6_ = uVar157;
          auVar66._4_2_ = auVar105._2_2_;
          auVar66._0_4_ = auVar111._0_4_;
          auVar66._6_8_ = SUB148(auVar129 << 0x40,6);
          fVar303 = *(float *)(uVar173 + 0x78 + lVar164);
          fVar305 = *(float *)(uVar173 + 0x6c + lVar164);
          uVar161 = *(undefined4 *)(uVar173 + 0x2c + lVar164);
          uVar172 = (ulong)(ushort)uVar161 & 0xffffffffffff00ff;
          auVar90._8_4_ = 0;
          auVar90._0_8_ = uVar172;
          auVar90[0xc] = (char)((uint)uVar161 >> 0x18);
          auVar91[8] = (char)((uint)uVar161 >> 0x10);
          auVar91._0_8_ = uVar172;
          auVar91[9] = 0;
          auVar91._10_3_ = auVar90._10_3_;
          auVar130._5_8_ = 0;
          auVar130._0_5_ = auVar91._8_5_;
          auVar92[4] = (char)((uint)uVar161 >> 8);
          auVar92._0_4_ = (int)uVar172;
          auVar92[5] = 0;
          auVar92._6_7_ = SUB137(auVar130 << 0x40,6);
          fVar351 = (float)(int)uVar172 * fVar332 + fVar359;
          fVar353 = (float)auVar92._4_4_ * fVar332 + fVar359;
          fVar356 = (float)auVar91._8_4_ * fVar332 + fVar359;
          fVar359 = (float)(uint3)(auVar90._10_3_ >> 0x10) * fVar332 + fVar359;
          uVar161 = *(undefined4 *)(uVar173 + 0x5c + lVar164);
          uVar172 = (ulong)(ushort)uVar161 & 0xffffffffffff00ff;
          auVar93._8_4_ = 0;
          auVar93._0_8_ = uVar172;
          auVar93[0xc] = (char)((uint)uVar161 >> 0x18);
          auVar94[8] = (char)((uint)uVar161 >> 0x10);
          auVar94._0_8_ = uVar172;
          auVar94[9] = 0;
          auVar94._10_3_ = auVar93._10_3_;
          auVar131._5_8_ = 0;
          auVar131._0_5_ = auVar94._8_5_;
          auVar95[4] = (char)((uint)uVar161 >> 8);
          auVar95._0_4_ = (int)uVar172;
          auVar95[5] = 0;
          auVar95._6_7_ = SUB137(auVar131 << 0x40,6);
          auVar41[0xd] = 0;
          auVar41._0_13_ = auVar237._0_13_;
          auVar41[0xe] = auVar237[7];
          auVar50[0xc] = auVar237[6];
          auVar50._0_12_ = auVar237._0_12_;
          auVar50._13_2_ = auVar41._13_2_;
          auVar57[0xb] = 0;
          auVar57._0_11_ = auVar237._0_11_;
          auVar57._12_3_ = auVar50._12_3_;
          auVar67[10] = auVar237[5];
          auVar67._0_10_ = auVar237._0_10_;
          auVar67._11_4_ = auVar57._11_4_;
          auVar76[9] = 0;
          auVar76._0_9_ = auVar237._0_9_;
          auVar76._10_5_ = auVar67._10_5_;
          auVar82[8] = auVar237[4];
          auVar82._0_8_ = auVar237._0_8_;
          auVar82._9_6_ = auVar76._9_6_;
          auVar132._7_8_ = 0;
          auVar132._0_7_ = auVar82._8_7_;
          Var116 = CONCAT81(SUB158(auVar132 << 0x40,7),auVar237[3]);
          auVar152._9_6_ = 0;
          auVar152._0_9_ = Var116;
          auVar133._1_10_ = SUB1510(auVar152 << 0x30,5);
          auVar133[0] = auVar237[2];
          auVar153._11_4_ = 0;
          auVar153._0_11_ = auVar133;
          auVar106[2] = auVar237[1];
          auVar106._0_2_ = auVar237._0_2_;
          auVar106._3_12_ = SUB1512(auVar153 << 0x20,3);
          auVar112._2_13_ = auVar106._2_13_;
          auVar112._0_2_ = auVar237._0_2_ & 0xff;
          auVar42._10_2_ = 0;
          auVar42._0_10_ = auVar112._0_10_;
          auVar42._12_2_ = (short)Var116;
          uVar158 = CONCAT42(auVar42._10_4_,auVar133._0_2_);
          auVar134._6_8_ = 0;
          auVar134._0_6_ = uVar158;
          auVar68._4_2_ = auVar106._2_2_;
          auVar68._0_4_ = auVar112._0_4_;
          auVar68._6_8_ = SUB148(auVar134 << 0x40,6);
          fVar332 = *(float *)(uVar173 + 0x4c + lVar164);
          fVar368 = *(float *)(uVar173 + 0x40 + lVar164);
          fVar361 = (float)(auVar112._0_4_ & 0xffff) * fVar332 + fVar368;
          fVar363 = (float)auVar68._4_4_ * fVar332 + fVar368;
          fVar365 = (float)(int)uVar158 * fVar332 + fVar368;
          fVar367 = (float)(auVar42._10_4_ >> 0x10) * fVar332 + fVar368;
          auVar241 = *(undefined1 (*) [16])(uVar173 + 0x60 + lVar164);
          auVar43[0xd] = 0;
          auVar43._0_13_ = auVar241._0_13_;
          auVar43[0xe] = auVar241[7];
          auVar51[0xc] = auVar241[6];
          auVar51._0_12_ = auVar241._0_12_;
          auVar51._13_2_ = auVar43._13_2_;
          auVar58[0xb] = 0;
          auVar58._0_11_ = auVar241._0_11_;
          auVar58._12_3_ = auVar51._12_3_;
          auVar69[10] = auVar241[5];
          auVar69._0_10_ = auVar241._0_10_;
          auVar69._11_4_ = auVar58._11_4_;
          auVar77[9] = 0;
          auVar77._0_9_ = auVar241._0_9_;
          auVar77._10_5_ = auVar69._10_5_;
          auVar83[8] = auVar241[4];
          auVar83._0_8_ = auVar241._0_8_;
          auVar83._9_6_ = auVar77._9_6_;
          auVar135._7_8_ = 0;
          auVar135._0_7_ = auVar83._8_7_;
          Var116 = CONCAT81(SUB158(auVar135 << 0x40,7),auVar241[3]);
          auVar154._9_6_ = 0;
          auVar154._0_9_ = Var116;
          auVar136._1_10_ = SUB1510(auVar154 << 0x30,5);
          auVar136[0] = auVar241[2];
          auVar155._11_4_ = 0;
          auVar155._0_11_ = auVar136;
          auVar107[2] = auVar241[1];
          auVar107._0_2_ = auVar241._0_2_;
          auVar107._3_12_ = SUB1512(auVar155 << 0x20,3);
          auVar113._2_13_ = auVar107._2_13_;
          auVar113._0_2_ = auVar241._0_2_ & 0xff;
          auVar44._10_2_ = 0;
          auVar44._0_10_ = auVar113._0_10_;
          auVar44._12_2_ = (short)Var116;
          uVar158 = CONCAT42(auVar44._10_4_,auVar136._0_2_);
          auVar137._6_8_ = 0;
          auVar137._0_6_ = uVar158;
          auVar70._4_2_ = auVar107._2_2_;
          auVar70._0_4_ = auVar113._0_4_;
          auVar70._6_8_ = SUB148(auVar137 << 0x40,6);
          fVar235 = *(float *)(uVar173 + 0x7c + lVar164);
          fVar349 = *(float *)(uVar173 + 0x70 + lVar164);
          uVar161 = *(undefined4 *)(uVar173 + 0x34 + lVar164);
          uVar175 = (ulong)(ushort)uVar161 & 0xffffffffffff00ff;
          auVar96._8_4_ = 0;
          auVar96._0_8_ = uVar175;
          auVar96[0xc] = (char)((uint)uVar161 >> 0x18);
          auVar97[8] = (char)((uint)uVar161 >> 0x10);
          auVar97._0_8_ = uVar175;
          auVar97[9] = 0;
          auVar97._10_3_ = auVar96._10_3_;
          auVar138._5_8_ = 0;
          auVar138._0_5_ = auVar97._8_5_;
          auVar98[4] = (char)((uint)uVar161 >> 8);
          auVar98._0_4_ = (int)uVar175;
          auVar98[5] = 0;
          auVar98._6_7_ = SUB137(auVar138 << 0x40,6);
          fVar362 = (float)(int)uVar175 * fVar332 + fVar368;
          fVar364 = (float)auVar98._4_4_ * fVar332 + fVar368;
          fVar366 = (float)auVar97._8_4_ * fVar332 + fVar368;
          fVar368 = (float)(uint3)(auVar96._10_3_ >> 0x10) * fVar332 + fVar368;
          uVar161 = *(undefined4 *)(uVar173 + 100 + lVar164);
          uVar175 = (ulong)(ushort)uVar161 & 0xffffffffffff00ff;
          auVar99._8_4_ = 0;
          auVar99._0_8_ = uVar175;
          auVar99[0xc] = (char)((uint)uVar161 >> 0x18);
          auVar100[8] = (char)((uint)uVar161 >> 0x10);
          auVar100._0_8_ = uVar175;
          auVar100[9] = 0;
          auVar100._10_3_ = auVar99._10_3_;
          auVar139._5_8_ = 0;
          auVar139._0_5_ = auVar100._8_5_;
          auVar101[4] = (char)((uint)uVar161 >> 8);
          auVar101._0_4_ = (int)uVar175;
          auVar101[5] = 0;
          auVar101._6_7_ = SUB137(auVar139 << 0x40,6);
          auVar240._0_8_ =
               CONCAT44((((((float)auVar62._4_4_ * fVar344 + fVar284) - fVar338) * fVar262 + fVar338
                         ) - fStack_1264) * fVar302,
                        (((((float)(auVar109._0_4_ & 0xffff) * fVar344 + fVar284) - fVar333) *
                          fVar262 + fVar333) - local_1268) * fVar391);
          auVar240._8_4_ =
               (((((float)(int)uVar156 * fVar344 + fVar284) - fVar340) * fVar262 + fVar340) -
               fStack_1260) * fVar304;
          auVar240._12_4_ =
               (((((float)(auVar36._10_4_ >> 0x10) * fVar344 + fVar284) - fVar342) * fVar262 +
                fVar342) - fStack_125c) * fVar306;
          auVar310._0_8_ =
               CONCAT44((((((float)auVar66._4_4_ * fVar303 + fVar305) - fVar352) * fVar262 + fVar352
                         ) - fStack_1274) * fStack_1194,
                        (((((float)(auVar111._0_4_ & 0xffff) * fVar303 + fVar305) - fVar350) *
                          fVar262 + fVar350) - local_1278) * local_1198);
          auVar310._8_4_ =
               (((((float)(int)uVar157 * fVar303 + fVar305) - fVar355) * fVar262 + fVar355) -
               fStack_1270) * fStack_1190;
          auVar310._12_4_ =
               (((((float)(auVar40._10_4_ >> 0x10) * fVar303 + fVar305) - fVar358) * fVar262 +
                fVar358) - fStack_126c) * fStack_118c;
          auVar290._0_4_ =
               (((((float)(int)uVar174 * fVar344 + fVar284) - fVar334) * fVar262 + fVar334) -
               local_1268) * local_11d8;
          auVar290._4_4_ =
               (((((float)auVar89._4_4_ * fVar344 + fVar284) - fVar339) * fVar262 + fVar339) -
               fStack_1264) * fStack_11d4;
          auVar290._8_4_ =
               (((((float)auVar88._8_4_ * fVar344 + fVar284) - fVar341) * fVar262 + fVar341) -
               fStack_1260) * fStack_11d0;
          auVar290._12_4_ =
               (((((float)(uint3)(auVar87._10_3_ >> 0x10) * fVar344 + fVar284) - fVar343) * fVar262
                + fVar343) - fStack_125c) * fStack_11cc;
          auVar325._0_4_ =
               (((((float)(int)uVar172 * fVar303 + fVar305) - fVar351) * fVar262 + fVar351) -
               local_1278) * fVar375;
          auVar325._4_4_ =
               (((((float)auVar95._4_4_ * fVar303 + fVar305) - fVar353) * fVar262 + fVar353) -
               fStack_1274) * fVar236;
          auVar325._8_4_ =
               (((((float)auVar94._8_4_ * fVar303 + fVar305) - fVar356) * fVar262 + fVar356) -
               fStack_1270) * fVar396;
          auVar325._12_4_ =
               (((((float)(uint3)(auVar93._10_3_ >> 0x10) * fVar303 + fVar305) - fVar359) * fVar262
                + fVar359) - fStack_126c) * fVar261;
          auVar265._8_4_ = auVar240._8_4_;
          auVar265._0_8_ = auVar240._0_8_;
          auVar265._12_4_ = auVar240._12_4_;
          auVar237 = minps(auVar265,auVar290);
          auVar241 = maxps(auVar240,auVar290);
          auVar291._8_4_ = auVar310._8_4_;
          auVar291._0_8_ = auVar310._0_8_;
          auVar291._12_4_ = auVar310._12_4_;
          auVar307 = minps(auVar291,auVar325);
          auVar237 = maxps(auVar237,auVar307);
          auVar307 = maxps(auVar310,auVar325);
          auVar316._0_8_ =
               CONCAT44((((((float)auVar70._4_4_ * fVar235 + fVar349) - fVar363) * fVar262 + fVar363
                         ) - fVar15) * fVar372,
                        (((((float)(auVar113._0_4_ & 0xffff) * fVar235 + fVar349) - fVar361) *
                          fVar262 + fVar361) - fVar15) * fVar386);
          auVar316._8_4_ =
               (((((float)(int)uVar158 * fVar235 + fVar349) - fVar365) * fVar262 + fVar365) - fVar15
               ) * fVar373;
          auVar316._12_4_ =
               (((((float)(auVar44._10_4_ >> 0x10) * fVar235 + fVar349) - fVar367) * fVar262 +
                fVar367) - fVar15) * fVar374;
          auVar335._0_4_ =
               (((((float)(int)uVar175 * fVar235 + fVar349) - fVar362) * fVar262 + fVar362) - fVar15
               ) * fVar380;
          auVar335._4_4_ =
               (((((float)auVar101._4_4_ * fVar235 + fVar349) - fVar364) * fVar262 + fVar364) -
               fVar15) * fVar283;
          auVar335._8_4_ =
               (((((float)auVar100._8_4_ * fVar235 + fVar349) - fVar366) * fVar262 + fVar366) -
               fVar15) * fVar384;
          auVar335._12_4_ =
               (((((float)(uint3)(auVar99._10_3_ >> 0x10) * fVar235 + fVar349) - fVar368) * fVar262
                + fVar368) - fVar15) * fVar369;
          auVar241 = minps(auVar241,auVar307);
          auVar292._8_4_ = auVar316._8_4_;
          auVar292._0_8_ = auVar316._0_8_;
          auVar292._12_4_ = auVar316._12_4_;
          auVar307 = minps(auVar292,auVar335);
          auVar285 = maxps(auVar316,auVar335);
          auVar307 = maxps(auVar307,local_11a8);
          dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar237,auVar307);
          auVar237 = minps(auVar285,local_10e8);
          auVar241 = minps(auVar241,auVar237);
          auVar266._0_4_ = -(uint)(auVar241._0_4_ < dist.field_0._0_4_);
          auVar266._4_4_ = -(uint)(auVar241._4_4_ < dist.field_0._4_4_);
          auVar266._8_4_ = -(uint)(auVar241._8_4_ < dist.field_0._8_4_);
          auVar266._12_4_ = -(uint)(auVar241._12_4_ < dist.field_0._12_4_);
          Var142 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(
                                                  CONCAT11(cVar234,cVar234),cVar231),cVar231),
                                                  cVar229),cVar229),cVar227),
                                                  CONCAT11(cVar227,cVar234)) >> 8),cVar225),cVar225)
          ;
          auVar141._2_10_ = Var142;
          auVar141[1] = cVar223;
          auVar141[0] = cVar223;
          auVar140._2_12_ = auVar141;
          auVar140[1] = cVar221;
          auVar140[0] = cVar221;
          auVar200._0_2_ = CONCAT11(cVar195,cVar195);
          auVar200._2_14_ = auVar140;
          uVar232 = (undefined2)Var142;
          auVar204._0_12_ = auVar200._0_12_;
          auVar204._12_2_ = uVar232;
          auVar204._14_2_ = uVar232;
          auVar203._12_4_ = auVar204._12_4_;
          auVar203._0_10_ = auVar200._0_10_;
          auVar203._10_2_ = auVar141._0_2_;
          auVar202._10_6_ = auVar203._10_6_;
          auVar202._0_8_ = auVar200._0_8_;
          auVar202._8_2_ = auVar141._0_2_;
          auVar201._8_8_ = auVar202._8_8_;
          auVar201._6_2_ = auVar140._0_2_;
          auVar201._4_2_ = auVar140._0_2_;
          auVar201._2_2_ = auVar200._0_2_;
          auVar201._0_2_ = auVar200._0_2_;
          uVar170 = movmskps((int)lVar164,~auVar266 & auVar201);
          auVar241 = local_11a8;
          fVar349 = local_1198;
          fVar262 = fStack_1194;
          fVar333 = fStack_1190;
          fVar334 = fStack_118c;
          if (uVar170 != 0) {
            lVar164 = lVar164 + uVar173;
            local_11e8 = (ulong)(uVar170 & 0xff);
            do {
              lVar178 = 0;
              if (local_11e8 != 0) {
                for (; (local_11e8 >> lVar178 & 1) == 0; lVar178 = lVar178 + 1) {
                }
              }
              local_fb8 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
              if (dist.field_0.v[lVar178] <= *(float *)(ray + k * 4 + 0x80)) {
                local_11f0 = (ulong)*(uint *)(lVar164 + 0x88);
                local_1400 = (ulong)*(uint *)(lVar164 + 4 + lVar178 * 8);
                local_11f8 = context->scene;
                pGVar19 = (local_11f8->geometries).items[local_11f0].ptr;
                lVar20 = *(long *)&pGVar19->field_0x58;
                lVar179 = local_1400 *
                          pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i;
                fVar343 = (pGVar19->time_range).lower;
                auVar242._0_4_ = (pGVar19->time_range).upper - fVar343;
                fVar332 = pGVar19->fnumTimeSegments;
                auVar293._0_4_ = *(float *)(ray + 0x70) - fVar343;
                auVar293._4_4_ = *(float *)(ray + 0x74) - fVar343;
                auVar293._8_4_ = *(float *)(ray + 0x78) - fVar343;
                auVar293._12_4_ = *(float *)(ray + 0x7c) - fVar343;
                auVar242._4_4_ = auVar242._0_4_;
                auVar242._8_4_ = auVar242._0_4_;
                auVar242._12_4_ = auVar242._0_4_;
                auVar241 = divps(auVar293,auVar242);
                fVar284 = auVar241._0_4_ * fVar332;
                fVar359 = auVar241._4_4_ * fVar332;
                fVar303 = auVar241._8_4_ * fVar332;
                fVar305 = auVar241._12_4_ * fVar332;
                fVar343 = floorf(fVar303);
                fVar344 = floorf(fVar305);
                fVar375 = floorf(fVar284);
                fVar380 = floorf(fVar359);
                uVar177 = local_11f0;
                ray = local_1200;
                auVar267._4_4_ = fVar380;
                auVar267._0_4_ = fVar375;
                auVar267._8_4_ = fVar343;
                auVar267._12_4_ = fVar344;
                auVar205._0_4_ = fVar332 + -1.0;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar241 = minps(auVar267,auVar205);
                auVar243._0_12_ = ZEXT812(0);
                auVar243._12_4_ = 0;
                auVar241 = maxps(auVar241,auVar243);
                ftime.field_0.v[0] = fVar284 - auVar241._0_4_;
                ftime.field_0.v[1] = fVar359 - auVar241._4_4_;
                ftime.field_0.v[2] = fVar303 - auVar241._8_4_;
                ftime.field_0.v[3] = fVar305 - auVar241._12_4_;
                itime.field_0.i[0] = (int)auVar241._0_4_;
                itime.field_0.i[1] = (int)auVar241._4_4_;
                itime.field_0.i[2] = (int)auVar241._8_4_;
                itime.field_0.i[3] = (int)auVar241._12_4_;
                uVar172 = *(ulong *)(lVar164 + lVar178 * 8);
                auVar206._8_8_ = 0;
                auVar206._0_8_ = uVar172;
                auVar206 = auVar206 & _DAT_01fab9a0;
                auVar45._10_2_ = 0;
                auVar45._0_10_ = auVar206._0_10_;
                auVar45._12_2_ = auVar206._6_2_;
                auVar52._8_2_ = auVar206._4_2_;
                auVar52._0_8_ = auVar206._0_8_;
                auVar52._10_4_ = auVar45._10_4_;
                auVar143._6_8_ = 0;
                auVar143._0_6_ = auVar52._8_6_;
                auVar71._4_2_ = auVar206._2_2_;
                auVar71._0_4_ = auVar206._0_4_;
                auVar71._6_8_ = SUB148(auVar143 << 0x40,6);
                sx.field_0.i[0] = (int)auVar206._0_2_;
                uVar174 = *(ulong *)(lVar20 + lVar179);
                uVar175 = (ulong)(uint)((int)((ulong)(auVar206._0_4_ >> 0x10) * (uVar174 >> 0x20)) +
                                       (int)uVar174 + sx.field_0.i[0]);
                lVar21 = *(long *)&pGVar19[2].numPrimitives;
                lVar171 = (long)itime.field_0.i[k] * 0x38;
                lVar22 = *(long *)(lVar21 + lVar171);
                lVar23 = *(long *)(lVar21 + 0x10 + lVar171);
                pfVar13 = (float *)(lVar22 + lVar23 * uVar175);
                lVar24 = *(long *)(lVar21 + 0x48 + lVar171);
                pfVar14 = (float *)(lVar22 + (uVar175 + 1) * lVar23);
                uVar174 = uVar174 >> 0x20;
                lVar178 = uVar175 + uVar174;
                lVar181 = uVar175 + uVar174 + 1;
                pfVar1 = (float *)(lVar22 + lVar178 * lVar23);
                pfVar2 = (float *)(lVar22 + lVar181 * lVar23);
                uVar180 = (ulong)(-1 < (short)uVar172);
                lVar169 = uVar175 + uVar180 + 1;
                pfVar3 = (float *)(lVar22 + lVar169 * lVar23);
                lVar176 = uVar180 + lVar181;
                pfVar4 = (float *)(lVar22 + lVar176 * lVar23);
                uVar180 = 0;
                if (-1 < (short)(uVar172 >> 0x10)) {
                  uVar180 = uVar174;
                }
                pfVar5 = (float *)(lVar22 + (lVar178 + uVar180) * lVar23);
                pfVar6 = (float *)(lVar22 + (lVar181 + uVar180) * lVar23);
                fVar380 = *(float *)(lVar22 + lVar23 * (uVar180 + lVar176) + 4);
                lVar21 = *(long *)(lVar21 + 0x38 + lVar171);
                pfVar7 = (float *)(lVar21 + lVar24 * uVar175);
                pfVar8 = (float *)(lVar21 + lVar24 * (uVar175 + 1));
                pfVar9 = (float *)(lVar21 + lVar24 * lVar178);
                pfVar10 = (float *)(lVar21 + lVar24 * lVar181);
                pfVar11 = (float *)(lVar21 + lVar24 * lVar169);
                fVar332 = *(float *)((long)&stack[-1].ptr.ptr + k * 4);
                pfVar12 = (float *)(lVar21 + lVar24 * lVar176);
                fVar361 = (*pfVar8 - *pfVar14) * fVar332 + *pfVar14;
                local_1088 = (pfVar8[1] - pfVar14[1]) * fVar332 + pfVar14[1];
                fVar396 = (pfVar8[2] - pfVar14[2]) * fVar332 + pfVar14[2];
                pfVar14 = (float *)(lVar21 + lVar24 * (lVar178 + uVar180));
                fVar262 = (*pfVar9 - *pfVar1) * fVar332 + *pfVar1;
                local_1098 = (pfVar9[1] - pfVar1[1]) * fVar332 + pfVar1[1];
                local_1438._0_4_ = (pfVar9[2] - pfVar1[2]) * fVar332 + pfVar1[2];
                pfVar1 = (float *)(lVar21 + lVar24 * (lVar181 + uVar180));
                fVar356 = (*pfVar10 - *pfVar2) * fVar332 + *pfVar2;
                fVar303 = (pfVar10[1] - pfVar2[1]) * fVar332 + pfVar2[1];
                fVar358 = (pfVar10[2] - pfVar2[2]) * fVar332 + pfVar2[2];
                fVar359 = *(float *)(lVar21 + (uVar180 + lVar176) * lVar24 + 4);
                fStack_1084 = (pfVar11[1] - pfVar3[1]) * fVar332 + pfVar3[1];
                fVar333 = (pfVar11[2] - pfVar3[2]) * fVar332 + pfVar3[2];
                fVar365 = (*pfVar12 - *pfVar4) * fVar332 + *pfVar4;
                fVar305 = (pfVar12[1] - pfVar4[1]) * fVar332 + pfVar4[1];
                fVar366 = (pfVar12[2] - pfVar4[2]) * fVar332 + pfVar4[2];
                fStack_1244 = (*pfVar14 - *pfVar5) * fVar332 + *pfVar5;
                fStack_108c = (pfVar14[1] - pfVar5[1]) * fVar332 + pfVar5[1];
                fStack_1054 = (pfVar14[2] - pfVar5[2]) * fVar332 + pfVar5[2];
                local_1248 = (*pfVar1 - *pfVar6) * fVar332 + *pfVar6;
                fVar368 = (pfVar1[1] - pfVar6[1]) * fVar332 + pfVar6[1];
                local_1058 = (pfVar1[2] - pfVar6[2]) * fVar332 + pfVar6[2];
                fVar343 = *(float *)(local_1200 + k * 4);
                fVar235 = ((*pfVar7 - *pfVar13) * fVar332 + *pfVar13) - fVar343;
                fVar261 = fVar361 - fVar343;
                fVar334 = fVar356 - fVar343;
                fVar340 = fVar262 - fVar343;
                local_1238 = CONCAT44(fVar356,fVar365);
                fVar361 = fVar361 - fVar343;
                fVar362 = ((*pfVar11 - *pfVar3) * fVar332 + *pfVar3) - fVar343;
                fVar363 = fVar365 - fVar343;
                fVar364 = fVar356 - fVar343;
                local_1258 = CONCAT44(fVar356,fVar262);
                fVar262 = fVar262 - fVar343;
                fVar338 = fVar356 - fVar343;
                fVar283 = local_1248 - fVar343;
                fVar343 = fStack_1244 - fVar343;
                fVar344 = *(float *)(local_1200 + k * 4 + 0x10);
                fVar284 = *(float *)(local_1200 + k * 4 + 0x20);
                local_fc8 = ((pfVar7[1] - pfVar13[1]) * fVar332 + pfVar13[1]) - fVar344;
                fStack_fc4 = local_1088 - fVar344;
                fStack_fc0 = fVar303 - fVar344;
                fStack_fbc = local_1098 - fVar344;
                local_fd8 = ((pfVar7[2] - pfVar13[2]) * fVar332 + pfVar13[2]) - fVar284;
                fStack_fd4 = fVar396 - fVar284;
                fStack_fd0 = fVar358 - fVar284;
                fStack_fcc = (float)local_1438 - fVar284;
                fStack_1094 = fVar303;
                fStack_1090 = fVar368;
                fVar386 = local_1098 - fVar344;
                fVar302 = fVar303 - fVar344;
                fVar304 = fVar368 - fVar344;
                fVar306 = fStack_108c - fVar344;
                local_1438._0_4_ = (float)local_1438 - fVar284;
                local_1438._4_4_ = fVar358 - fVar284;
                uStack_1430._0_4_ = local_1058 - fVar284;
                uStack_1430._4_4_ = fStack_1054 - fVar284;
                local_fe8 = fVar262 - fVar235;
                fStack_fe4 = fVar338 - fVar261;
                fStack_fe0 = fVar283 - fVar334;
                fStack_fdc = fVar343 - fVar340;
                local_1008 = fVar386 - local_fc8;
                fStack_1004 = fVar302 - fStack_fc4;
                fStack_1000 = fVar304 - fStack_fc0;
                fStack_ffc = fVar306 - fStack_fbc;
                local_ff8 = (float)local_1438 - local_fd8;
                fStack_ff4 = local_1438._4_4_ - fStack_fd4;
                fStack_ff0 = (float)uStack_1430 - fStack_fd0;
                fStack_fec = uStack_1430._4_4_ - fStack_fcc;
                fVar375 = *(float *)(local_1200 + k * 4 + 0x50);
                local_1488._4_4_ = fVar375;
                local_1488._0_4_ = fVar375;
                local_14d8._4_4_ = *(undefined4 *)(local_1200 + k * 4 + 0x60);
                local_14d8._0_4_ = local_14d8._4_4_;
                fStack_14d0 = (float)local_14d8._4_4_;
                fStack_14cc = (float)local_14d8._4_4_;
                fStack_143c = *(float *)(local_1200 + k * 4 + 0x40);
                fVar236 = (local_1008 * ((float)local_1438 + local_fd8) -
                          (fVar386 + local_fc8) * local_ff8) * fStack_143c +
                          ((fVar262 + fVar235) * local_ff8 -
                          ((float)local_1438 + local_fd8) * local_fe8) * fVar375 +
                          (local_fe8 * (fVar386 + local_fc8) - (fVar262 + fVar235) * local_1008) *
                          (float)local_14d8._4_4_;
                fVar349 = (fStack_1004 * (local_1438._4_4_ + fStack_fd4) -
                          (fVar302 + fStack_fc4) * fStack_ff4) * fStack_143c +
                          ((fVar338 + fVar261) * fStack_ff4 -
                          (local_1438._4_4_ + fStack_fd4) * fStack_fe4) * fVar375 +
                          (fStack_fe4 * (fVar302 + fStack_fc4) - (fVar338 + fVar261) * fStack_1004)
                          * (float)local_14d8._4_4_;
                local_1028._0_8_ = CONCAT44(fVar349,fVar236);
                local_1028._8_4_ =
                     (fStack_1000 * ((float)uStack_1430 + fStack_fd0) -
                     (fVar304 + fStack_fc0) * fStack_ff0) * fStack_143c +
                     ((fVar283 + fVar334) * fStack_ff0 -
                     ((float)uStack_1430 + fStack_fd0) * fStack_fe0) * fVar375 +
                     (fStack_fe0 * (fVar304 + fStack_fc0) - (fVar283 + fVar334) * fStack_1000) *
                     (float)local_14d8._4_4_;
                local_1028._12_4_ =
                     (fStack_ffc * (uStack_1430._4_4_ + fStack_fcc) -
                     (fVar306 + fStack_fbc) * fStack_fec) * fStack_143c +
                     ((fVar343 + fVar340) * fStack_fec -
                     (uStack_1430._4_4_ + fStack_fcc) * fStack_fdc) * fVar375 +
                     (fStack_fdc * (fVar306 + fStack_fbc) - (fVar343 + fVar340) * fStack_ffc) *
                     (float)local_14d8._4_4_;
                fStack_1080 = fVar305;
                fStack_107c = fVar303;
                fVar369 = local_1088 - fVar344;
                fVar372 = fStack_1084 - fVar344;
                fVar373 = fVar305 - fVar344;
                fVar374 = fVar303 - fVar344;
                local_1078 = CONCAT44(fVar333,fVar396);
                _local_1068 = CONCAT44(fVar358,fVar366);
                fVar396 = fVar396 - fVar284;
                fVar333 = fVar333 - fVar284;
                fVar339 = fVar366 - fVar284;
                fVar384 = fVar358 - fVar284;
                fVar391 = fVar235 - fVar361;
                fVar341 = fVar261 - fVar362;
                fVar342 = fVar334 - fVar363;
                fVar350 = fVar340 - fVar364;
                fVar392 = local_fc8 - fVar369;
                fVar394 = fStack_fc4 - fVar372;
                fVar397 = fStack_fc0 - fVar373;
                fVar400 = fStack_fbc - fVar374;
                local_1018 = local_fd8 - fVar396;
                fStack_1014 = fStack_fd4 - fVar333;
                fStack_1010 = fStack_fd0 - fVar339;
                fStack_100c = fStack_fcc - fVar384;
                local_1038._0_4_ =
                     (fVar392 * (local_fd8 + fVar396) - (local_fc8 + fVar369) * local_1018) *
                     fStack_143c +
                     ((fVar235 + fVar361) * local_1018 - (local_fd8 + fVar396) * fVar391) * fVar375
                     + (fVar391 * (local_fc8 + fVar369) - (fVar235 + fVar361) * fVar392) *
                       (float)local_14d8._4_4_;
                local_1038._4_4_ =
                     (fVar394 * (fStack_fd4 + fVar333) - (fStack_fc4 + fVar372) * fStack_1014) *
                     fStack_143c +
                     ((fVar261 + fVar362) * fStack_1014 - (fStack_fd4 + fVar333) * fVar341) *
                     fVar375 + (fVar341 * (fStack_fc4 + fVar372) - (fVar261 + fVar362) * fVar394) *
                               (float)local_14d8._4_4_;
                local_1038._8_4_ =
                     (fVar397 * (fStack_fd0 + fVar339) - (fStack_fc0 + fVar373) * fStack_1010) *
                     fStack_143c +
                     ((fVar334 + fVar363) * fStack_1010 - (fStack_fd0 + fVar339) * fVar342) *
                     fVar375 + (fVar342 * (fStack_fc0 + fVar373) - (fVar334 + fVar363) * fVar397) *
                               (float)local_14d8._4_4_;
                local_1038._12_4_ =
                     (fVar400 * (fStack_fcc + fVar384) - (fStack_fbc + fVar374) * fStack_100c) *
                     fStack_143c +
                     ((fVar340 + fVar364) * fStack_100c - (fStack_fcc + fVar384) * fVar350) *
                     fVar375 + (fVar350 * (fStack_fbc + fVar374) - (fVar340 + fVar364) * fVar400) *
                               (float)local_14d8._4_4_;
                fVar351 = fVar361 - fVar262;
                fVar352 = fVar362 - fVar338;
                fVar353 = fVar363 - fVar283;
                fVar355 = fVar364 - fVar343;
                fVar376 = fVar369 - fVar386;
                fVar377 = fVar372 - fVar302;
                fVar378 = fVar373 - fVar304;
                fVar379 = fVar374 - fVar306;
                fVar367 = fVar396 - (float)local_1438;
                fVar354 = fVar333 - local_1438._4_4_;
                fVar357 = fVar339 - (float)uStack_1430;
                fVar360 = fVar384 - uStack_1430._4_4_;
                local_1358 = fVar369 + fVar386;
                fStack_1354 = fVar372 + fVar302;
                fStack_1350 = fVar373 + fVar304;
                fStack_134c = fVar374 + fVar306;
                uStack_1480._0_4_ = fVar375;
                uStack_1480._4_4_ = fVar375;
                local_1348 = fVar396 + (float)local_1438;
                fStack_1344 = fVar333 + local_1438._4_4_;
                fStack_1340 = fVar339 + (float)uStack_1430;
                fStack_133c = fVar384 + uStack_1430._4_4_;
                auVar207._0_4_ =
                     (fVar376 * local_1348 - local_1358 * fVar367) * fStack_143c +
                     ((fVar262 + fVar361) * fVar367 - fVar351 * local_1348) * fVar375 +
                     (fVar351 * local_1358 - (fVar262 + fVar361) * fVar376) *
                     (float)local_14d8._4_4_;
                auVar207._4_4_ =
                     (fVar377 * fStack_1344 - fStack_1354 * fVar354) * fStack_143c +
                     ((fVar338 + fVar362) * fVar354 - fVar352 * fStack_1344) * fVar375 +
                     (fVar352 * fStack_1354 - (fVar338 + fVar362) * fVar377) *
                     (float)local_14d8._4_4_;
                auVar207._8_4_ =
                     (fVar378 * fStack_1340 - fStack_1350 * fVar357) * fStack_143c +
                     ((fVar283 + fVar363) * fVar357 - fVar353 * fStack_1340) * fVar375 +
                     (fVar353 * fStack_1350 - (fVar283 + fVar363) * fVar378) *
                     (float)local_14d8._4_4_;
                auVar207._12_4_ =
                     (fVar379 * fStack_133c - fStack_134c * fVar360) * fStack_143c +
                     ((fVar343 + fVar364) * fVar360 - fVar355 * fStack_133c) * fVar375 +
                     (fVar355 * fStack_134c - (fVar343 + fVar364) * fVar379) *
                     (float)local_14d8._4_4_;
                local_1048 = fVar236 + local_1038._0_4_ + auVar207._0_4_;
                fStack_1044 = fVar349 + local_1038._4_4_ + auVar207._4_4_;
                fStack_1040 = local_1028._8_4_ + local_1038._8_4_ + auVar207._8_4_;
                fStack_103c = local_1028._12_4_ + local_1038._12_4_ + auVar207._12_4_;
                auVar326._8_4_ = local_1028._8_4_;
                auVar326._0_8_ = local_1028._0_8_;
                auVar326._12_4_ = local_1028._12_4_;
                auVar241 = minps(auVar326,local_1038);
                auVar241 = minps(auVar241,auVar207);
                auVar370._8_4_ = local_1028._8_4_;
                auVar370._0_8_ = local_1028._0_8_;
                auVar370._12_4_ = local_1028._12_4_;
                auVar237 = maxps(auVar370,local_1038);
                auVar237 = maxps(auVar237,auVar207);
                fVar343 = ABS(local_1048);
                fVar262 = ABS(fStack_1044);
                fVar338 = ABS(fStack_1040);
                fVar283 = ABS(fStack_103c);
                auVar371._4_4_ = -(uint)(auVar237._4_4_ <= fVar262 * 1.1920929e-07);
                auVar371._0_4_ = -(uint)(auVar237._0_4_ <= fVar343 * 1.1920929e-07);
                auVar371._8_4_ = -(uint)(auVar237._8_4_ <= fVar338 * 1.1920929e-07);
                auVar371._12_4_ = -(uint)(auVar237._12_4_ <= fVar283 * 1.1920929e-07);
                auVar327._4_4_ = -(uint)(-(fVar262 * 1.1920929e-07) <= auVar241._4_4_);
                auVar327._0_4_ = -(uint)(-(fVar343 * 1.1920929e-07) <= auVar241._0_4_);
                auVar327._8_4_ = -(uint)(-(fVar338 * 1.1920929e-07) <= auVar241._8_4_);
                auVar327._12_4_ = -(uint)(-(fVar283 * 1.1920929e-07) <= auVar241._12_4_);
                auVar371 = auVar371 | auVar327;
                iVar160 = movmskps((int)lVar24,auVar371);
                sy.field_0.i[1] = auVar71._4_4_;
                sx.field_0.i[1] = sx.field_0.i[0];
                sx.field_0.i[2] = sx.field_0.i[0];
                sx.field_0.i[3] = sx.field_0.i[0];
                uVar170 = (uint)local_11f0;
                local_11b8 = ZEXT416(uVar170);
                local_11c8 = ZEXT416((uint)local_1400);
                uVar161 = (undefined4)k;
                uVar167 = (undefined4)(k >> 0x20);
                if (iVar160 != 0) {
                  local_1058 = fVar343;
                  fStack_1054 = fVar262;
                  fStack_1050 = fVar338;
                  fStack_104c = fVar283;
                  uVar182 = -(uint)(ABS(fVar376 * local_1018) <= ABS(fVar392 * local_ff8));
                  uVar185 = -(uint)(ABS(fVar377 * fStack_1014) <= ABS(fVar394 * fStack_ff4));
                  uVar188 = -(uint)(ABS(fVar378 * fStack_1010) <= ABS(fVar397 * fStack_ff0));
                  uVar191 = -(uint)(ABS(fVar379 * fStack_100c) <= ABS(fVar400 * fStack_fec));
                  uVar183 = -(uint)(ABS(fVar391 * fVar367) <= ABS(local_fe8 * local_1018));
                  uVar186 = -(uint)(ABS(fVar341 * fVar354) <= ABS(fStack_fe4 * fStack_1014));
                  uVar189 = -(uint)(ABS(fVar342 * fVar357) <= ABS(fStack_fe0 * fStack_1010));
                  uVar192 = -(uint)(ABS(fVar350 * fVar360) <= ABS(fStack_fdc * fStack_100c));
                  uVar184 = -(uint)(ABS(fVar351 * fVar392) <= ABS(fVar391 * local_1008));
                  uVar187 = -(uint)(ABS(fVar352 * fVar394) <= ABS(fVar341 * fStack_1004));
                  uVar190 = -(uint)(ABS(fVar353 * fVar397) <= ABS(fVar342 * fStack_1000));
                  uVar193 = -(uint)(ABS(fVar355 * fVar400) <= ABS(fVar350 * fStack_ffc));
                  fVar361 = (float)(~uVar182 & (uint)(local_1008 * local_1018 - fVar392 * local_ff8)
                                   | (uint)(fVar392 * fVar367 - fVar376 * local_1018) & uVar182);
                  fVar362 = (float)(~uVar185 &
                                    (uint)(fStack_1004 * fStack_1014 - fVar394 * fStack_ff4) |
                                   (uint)(fVar394 * fVar354 - fVar377 * fStack_1014) & uVar185);
                  fVar363 = (float)(~uVar188 &
                                    (uint)(fStack_1000 * fStack_1010 - fVar397 * fStack_ff0) |
                                   (uint)(fVar397 * fVar357 - fVar378 * fStack_1010) & uVar188);
                  fVar364 = (float)(~uVar191 &
                                    (uint)(fStack_ffc * fStack_100c - fVar400 * fStack_fec) |
                                   (uint)(fVar400 * fVar360 - fVar379 * fStack_100c) & uVar191);
                  auVar317._0_4_ = (uint)(fVar351 * local_1018 - fVar391 * fVar367) & uVar183;
                  auVar317._4_4_ = (uint)(fVar352 * fStack_1014 - fVar341 * fVar354) & uVar186;
                  auVar317._8_4_ = (uint)(fVar353 * fStack_1010 - fVar342 * fVar357) & uVar189;
                  auVar317._12_4_ = (uint)(fVar355 * fStack_100c - fVar350 * fVar360) & uVar192;
                  auVar328._0_4_ = ~uVar183 & (uint)(local_ff8 * fVar391 - local_fe8 * local_1018);
                  auVar328._4_4_ =
                       ~uVar186 & (uint)(fStack_ff4 * fVar341 - fStack_fe4 * fStack_1014);
                  auVar328._8_4_ =
                       ~uVar189 & (uint)(fStack_ff0 * fVar342 - fStack_fe0 * fStack_1010);
                  auVar328._12_4_ =
                       ~uVar192 & (uint)(fStack_fec * fVar350 - fStack_fdc * fStack_100c);
                  auVar328 = auVar328 | auVar317;
                  fVar351 = (float)(~uVar184 & (uint)(local_fe8 * fVar392 - fVar391 * local_1008) |
                                   (uint)(fVar391 * fVar376 - fVar351 * fVar392) & uVar184);
                  fVar352 = (float)(~uVar187 & (uint)(fStack_fe4 * fVar394 - fVar341 * fStack_1004)
                                   | (uint)(fVar341 * fVar377 - fVar352 * fVar394) & uVar187);
                  fVar353 = (float)(~uVar190 & (uint)(fStack_fe0 * fVar397 - fVar342 * fStack_1000)
                                   | (uint)(fVar342 * fVar378 - fVar353 * fVar397) & uVar190);
                  fVar355 = (float)(~uVar193 & (uint)(fStack_fdc * fVar400 - fVar350 * fStack_ffc) |
                                   (uint)(fVar350 * fVar379 - fVar355 * fVar400) & uVar193);
                  fVar391 = fStack_143c * fVar361 +
                            fVar375 * auVar328._0_4_ + (float)local_14d8._4_4_ * fVar351;
                  fVar341 = fStack_143c * fVar362 +
                            fVar375 * auVar328._4_4_ + (float)local_14d8._4_4_ * fVar352;
                  fVar342 = fStack_143c * fVar363 +
                            fVar375 * auVar328._8_4_ + (float)local_14d8._4_4_ * fVar353;
                  fVar350 = fStack_143c * fVar364 +
                            fVar375 * auVar328._12_4_ + (float)local_14d8._4_4_ * fVar355;
                  auVar294._0_4_ = fVar391 + fVar391;
                  auVar294._4_4_ = fVar341 + fVar341;
                  auVar294._8_4_ = fVar342 + fVar342;
                  auVar294._12_4_ = fVar350 + fVar350;
                  auVar208._0_4_ = local_fc8 * auVar328._0_4_ + local_fd8 * fVar351;
                  auVar208._4_4_ = fStack_fc4 * auVar328._4_4_ + fStack_fd4 * fVar352;
                  auVar208._8_4_ = fStack_fc0 * auVar328._8_4_ + fStack_fd0 * fVar353;
                  auVar208._12_4_ = fStack_fbc * auVar328._12_4_ + fStack_fcc * fVar355;
                  fVar391 = fVar235 * fVar361 + auVar208._0_4_;
                  fVar341 = fVar261 * fVar362 + auVar208._4_4_;
                  fVar342 = fVar334 * fVar363 + auVar208._8_4_;
                  fVar350 = fVar340 * fVar364 + auVar208._12_4_;
                  auVar241 = rcpps(auVar208,auVar294);
                  fVar235 = auVar241._0_4_;
                  fVar261 = auVar241._4_4_;
                  fVar334 = auVar241._8_4_;
                  fVar340 = auVar241._12_4_;
                  fVar391 = ((1.0 - auVar294._0_4_ * fVar235) * fVar235 + fVar235) *
                            (fVar391 + fVar391);
                  fVar261 = ((1.0 - auVar294._4_4_ * fVar261) * fVar261 + fVar261) *
                            (fVar341 + fVar341);
                  fVar334 = ((1.0 - auVar294._8_4_ * fVar334) * fVar334 + fVar334) *
                            (fVar342 + fVar342);
                  fVar340 = ((1.0 - auVar294._12_4_ * fVar340) * fVar340 + fVar340) *
                            (fVar350 + fVar350);
                  fVar235 = *(float *)(local_1200 + k * 4 + 0x30);
                  auVar209._0_4_ =
                       -(uint)(fVar391 <= (float)local_fb8._0_4_ && fVar235 <= fVar391) &
                       auVar371._0_4_;
                  auVar209._4_4_ =
                       -(uint)(fVar261 <= (float)local_fb8._0_4_ && fVar235 <= fVar261) &
                       auVar371._4_4_;
                  auVar209._8_4_ =
                       -(uint)(fVar334 <= (float)local_fb8._0_4_ && fVar235 <= fVar334) &
                       auVar371._8_4_;
                  auVar209._12_4_ =
                       -(uint)(fVar340 <= (float)local_fb8._0_4_ && fVar235 <= fVar340) &
                       auVar371._12_4_;
                  iVar160 = movmskps(uVar161,auVar209);
                  if (iVar160 != 0) {
                    aVar210._0_4_ = auVar209._0_4_ & -(uint)(auVar294._0_4_ != 0.0);
                    aVar210._4_4_ = auVar209._4_4_ & -(uint)(auVar294._4_4_ != 0.0);
                    aVar210._8_4_ = auVar209._8_4_ & -(uint)(auVar294._8_4_ != 0.0);
                    aVar210._12_4_ = auVar209._12_4_ & -(uint)(auVar294._12_4_ != 0.0);
                    iVar160 = movmskps(iVar160,(undefined1  [16])aVar210);
                    if (iVar160 != 0) {
                      auVar114._4_4_ = fStack_1044;
                      auVar114._0_4_ = local_1048;
                      auVar114._8_4_ = fStack_1040;
                      auVar114._12_4_ = fStack_103c;
                      local_12b8._4_4_ = fVar261;
                      local_12b8._0_4_ = fVar391;
                      fStack_12b0 = fVar334;
                      fStack_12ac = fVar340;
                      local_12a8[0] = fVar361;
                      local_12a8[1] = fVar362;
                      local_12a8[2] = fVar363;
                      local_12a8[3] = fVar364;
                      _local_1298 = auVar328;
                      local_1288[0] = fVar351;
                      local_1288[1] = fVar352;
                      local_1288[2] = fVar353;
                      local_1288[3] = fVar355;
                      auVar318._4_12_ = auVar317._4_12_;
                      auVar318._0_4_ = (float)(int)(*(ushort *)(lVar20 + 8 + lVar179) - 1);
                      auVar336._4_4_ = auVar317._4_4_;
                      auVar336._0_4_ = auVar318._0_4_;
                      auVar336._8_4_ = auVar317._8_4_;
                      auVar336._12_4_ = auVar317._12_4_;
                      auVar241 = rcpss(auVar336,auVar318);
                      auVar345._4_12_ = local_1488._4_12_;
                      auVar345._0_4_ = (float)(int)(*(ushort *)(lVar20 + 10 + lVar179) - 1);
                      fVar235 = (2.0 - auVar318._0_4_ * auVar241._0_4_) * auVar241._0_4_;
                      auVar337._4_4_ = fVar375;
                      auVar337._0_4_ = auVar345._0_4_;
                      auVar337._8_4_ = fVar375;
                      auVar337._12_4_ = fVar375;
                      auVar241 = rcpss(auVar337,auVar345);
                      fVar375 = (2.0 - auVar345._0_4_ * auVar241._0_4_) * auVar241._0_4_;
                      tNear.field_0.v[0] = fVar235 * (fVar236 + (float)sx.field_0.i[0] * local_1048)
                      ;
                      tNear.field_0.v[1] =
                           fVar235 * (fVar349 + (float)(sx.field_0.i[0] + 1) * fStack_1044);
                      tNear.field_0.v[2] =
                           fVar235 * (local_1028._8_4_ + (float)(sx.field_0.i[0] + 1) * fStack_1040)
                      ;
                      tNear.field_0.v[3] =
                           fVar235 * (local_1028._12_4_ + (float)sx.field_0.i[0] * fStack_103c);
                      auVar311._0_4_ = (float)sy.field_0.i[1] * local_1048 + local_1038._0_4_;
                      auVar311._4_4_ = (float)sy.field_0.i[1] * fStack_1044 + local_1038._4_4_;
                      auVar311._8_4_ = (float)(sy.field_0.i[1] + 1) * fStack_1040 + local_1038._8_4_
                      ;
                      auVar311._12_4_ =
                           (float)(sy.field_0.i[1] + 1) * fStack_103c + local_1038._12_4_;
                      pGVar19 = (local_11f8->geometries).items[local_11f0].ptr;
                      if ((pGVar19->mask & *(uint *)(local_1200 + k * 4 + 0x90)) != 0) {
                        auVar241 = rcpps(auVar311,auVar114);
                        fVar235 = auVar241._0_4_;
                        fVar236 = auVar241._4_4_;
                        fVar349 = auVar241._8_4_;
                        fVar341 = auVar241._12_4_;
                        fVar343 = (float)(-(uint)(1e-18 <= fVar343) &
                                         (uint)(((float)DAT_01f7ba10 - local_1048 * fVar235) *
                                                fVar235 + fVar235));
                        fVar235 = (float)(-(uint)(1e-18 <= fVar262) &
                                         (uint)((DAT_01f7ba10._4_4_ - fStack_1044 * fVar236) *
                                                fVar236 + fVar236));
                        fVar236 = (float)(-(uint)(1e-18 <= fVar338) &
                                         (uint)((DAT_01f7ba10._8_4_ - fStack_1040 * fVar349) *
                                                fVar349 + fVar349));
                        fVar349 = (float)(-(uint)(1e-18 <= fVar283) &
                                         (uint)((DAT_01f7ba10._12_4_ - fStack_103c * fVar341) *
                                                fVar341 + fVar341));
                        auVar295._0_4_ = tNear.field_0.v[0] * fVar343;
                        auVar295._4_4_ = tNear.field_0.v[1] * fVar235;
                        auVar295._8_4_ = tNear.field_0.v[2] * fVar236;
                        auVar295._12_4_ = tNear.field_0.v[3] * fVar349;
                        local_12d8 = minps(auVar295,_DAT_01f7ba10);
                        auVar319._0_4_ = fVar375 * auVar311._0_4_ * fVar343;
                        auVar319._4_4_ = fVar375 * auVar311._4_4_ * fVar235;
                        auVar319._8_4_ = fVar375 * auVar311._8_4_ * fVar236;
                        auVar319._12_4_ = fVar375 * auVar311._12_4_ * fVar349;
                        local_12c8 = minps(auVar319,_DAT_01f7ba10);
                        auVar244._0_4_ = (uint)fVar391 & aVar210._0_4_;
                        auVar244._4_4_ = (uint)fVar261 & aVar210._4_4_;
                        auVar244._8_4_ = (uint)fVar334 & aVar210._8_4_;
                        auVar244._12_4_ = (uint)fVar340 & aVar210._12_4_;
                        auVar268._0_8_ =
                             CONCAT44(~aVar210._4_4_,~aVar210._0_4_) & 0x7f8000007f800000;
                        auVar268._8_4_ = ~aVar210._8_4_ & 0x7f800000;
                        auVar268._12_4_ = ~aVar210._12_4_ & 0x7f800000;
                        auVar268 = auVar268 | auVar244;
                        auVar296._4_4_ = auVar268._0_4_;
                        auVar296._0_4_ = auVar268._4_4_;
                        auVar296._8_4_ = auVar268._12_4_;
                        auVar296._12_4_ = auVar268._8_4_;
                        auVar241 = minps(auVar296,auVar268);
                        auVar245._0_8_ = auVar241._8_8_;
                        auVar245._8_4_ = auVar241._0_4_;
                        auVar245._12_4_ = auVar241._4_4_;
                        auVar241 = minps(auVar245,auVar241);
                        uVar186 = -(uint)(auVar241._0_4_ == auVar268._0_4_);
                        uVar187 = -(uint)(auVar241._4_4_ == auVar268._4_4_);
                        uVar188 = -(uint)(auVar241._8_4_ == auVar268._8_4_);
                        uVar189 = -(uint)(auVar241._12_4_ == auVar268._12_4_);
                        auVar269._0_4_ = uVar186 & aVar210._0_4_;
                        auVar269._4_4_ = uVar187 & aVar210._4_4_;
                        auVar269._8_4_ = uVar188 & aVar210._8_4_;
                        auVar269._12_4_ = uVar189 & aVar210._12_4_;
                        iVar160 = movmskps(*(uint *)(local_1200 + k * 4 + 0x90),auVar269);
                        uVar182 = 0xffffffff;
                        uVar183 = 0xffffffff;
                        uVar184 = 0xffffffff;
                        uVar185 = 0xffffffff;
                        if (iVar160 != 0) {
                          uVar182 = uVar186;
                          uVar183 = uVar187;
                          uVar184 = uVar188;
                          uVar185 = uVar189;
                        }
                        auVar211._0_4_ = aVar210._0_4_ & uVar182;
                        auVar211._4_4_ = aVar210._4_4_ & uVar183;
                        auVar211._8_4_ = aVar210._8_4_ & uVar184;
                        auVar211._12_4_ = aVar210._12_4_ & uVar185;
                        uVar182 = movmskps(iVar160,auVar211);
                        lVar178 = 0;
                        if (uVar182 != 0) {
                          for (; (uVar182 >> lVar178 & 1) == 0; lVar178 = lVar178 + 1) {
                          }
                        }
                        valid.field_0 = aVar210;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar162 = *(undefined4 *)(local_12d8 + lVar178 * 4);
                          uVar16 = *(undefined4 *)(local_12c8 + lVar178 * 4);
                          fVar343 = local_12a8[lVar178];
                          fVar375 = local_1288[lVar178 + -4];
                          fVar235 = local_1288[lVar178];
                          *(float *)(local_1200 + k * 4 + 0x80) = local_12a8[lVar178 + -4];
                          *(float *)(local_1200 + k * 4 + 0xc0) = fVar343;
                          *(float *)(local_1200 + k * 4 + 0xd0) = fVar375;
                          *(float *)(local_1200 + k * 4 + 0xe0) = fVar235;
                          *(undefined4 *)(local_1200 + k * 4 + 0xf0) = uVar162;
                          *(undefined4 *)(local_1200 + k * 4 + 0x100) = uVar16;
                          *(uint *)(local_1200 + k * 4 + 0x110) = (uint)local_1400;
                          *(uint *)(local_1200 + k * 4 + 0x120) = uVar170;
                          *(uint *)(local_1200 + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(local_1200 + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_1488._4_4_ = uVar170;
                          local_1488._0_4_ = uVar170;
                          uStack_1480._0_4_ = (float)uVar170;
                          uStack_1480._4_4_ = (float)uVar170;
                          local_1438 = CONCAT44((uint)local_1400,(uint)local_1400);
                          uStack_1430._0_4_ = (float)(uint)local_1400;
                          uStack_1430._4_4_ = (float)(uint)local_1400;
                          auVar141 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar163);
                          fStack_143c = (float)((ulong)*(undefined8 *)
                                                        (mm_lookupmask_ps + lVar163 + 8) >> 0x20);
                          _local_14d8 = ZEXT416(*(uint *)(local_1200 + k * 4 + 0x80));
                          while( true ) {
                            local_1148 = *(undefined4 *)(local_12d8 + lVar178 * 4);
                            local_1138._4_4_ = *(undefined4 *)(local_12c8 + lVar178 * 4);
                            *(float *)(ray + k * 4 + 0x80) = local_12a8[lVar178 + -4];
                            args.context = context->user;
                            local_1178 = local_12a8[lVar178];
                            local_1168._4_4_ = local_1288[lVar178 + -4];
                            local_1158._4_4_ = local_1288[lVar178];
                            fStack_1174 = local_1178;
                            fStack_1170 = local_1178;
                            fStack_116c = local_1178;
                            local_1168._0_4_ = local_1168._4_4_;
                            fStack_1160 = (float)local_1168._4_4_;
                            fStack_115c = (float)local_1168._4_4_;
                            local_1158._0_4_ = local_1158._4_4_;
                            fStack_1150 = (float)local_1158._4_4_;
                            fStack_114c = (float)local_1158._4_4_;
                            uStack_1144 = local_1148;
                            uStack_1140 = local_1148;
                            uStack_113c = local_1148;
                            local_1138._0_4_ = local_1138._4_4_;
                            local_1138._8_4_ = local_1138._4_4_;
                            local_1138._12_4_ = local_1138._4_4_;
                            local_1128 = local_1438;
                            uStack_1120 = uStack_1430;
                            local_1118 = local_1488;
                            uStack_1110 = uStack_1480;
                            local_1108 = (args.context)->instID[0];
                            uStack_1104 = local_1108;
                            uStack_1100 = local_1108;
                            uStack_10fc = local_1108;
                            local_10f8 = (args.context)->instPrimID[0];
                            uStack_10f4 = local_10f8;
                            uStack_10f0 = local_10f8;
                            uStack_10ec = local_10f8;
                            local_1418._12_4_ = fStack_143c;
                            local_1418._0_12_ = auVar141;
                            args.valid = (int *)local_1418;
                            args.geometryUserPtr = pGVar19->userPtr;
                            args.ray = (RTCRayN *)ray;
                            args.hit = (RTCHitN *)&local_1178;
                            args.N = 4;
                            p_Var166 = pGVar19->intersectionFilterN;
                            if (p_Var166 != (RTCFilterFunctionN)0x0) {
                              p_Var166 = (RTCFilterFunctionN)(*p_Var166)(&args);
                            }
                            auVar251._0_4_ = -(uint)(local_1418._0_4_ == 0);
                            auVar251._4_4_ = -(uint)(local_1418._4_4_ == 0);
                            auVar251._8_4_ = -(uint)(local_1418._8_4_ == 0);
                            auVar251._12_4_ = -(uint)(local_1418._12_4_ == 0);
                            uVar182 = movmskps((int)p_Var166,auVar251);
                            pRVar165 = (RTCRayN *)(ulong)(uVar182 ^ 0xf);
                            if ((uVar182 ^ 0xf) == 0) {
                              auVar251 = auVar251 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var166 = context->args->filter;
                              if ((p_Var166 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                                p_Var166 = (RTCFilterFunctionN)(*p_Var166)(&args);
                              }
                              auVar216._0_4_ = -(uint)(local_1418._0_4_ == 0);
                              auVar216._4_4_ = -(uint)(local_1418._4_4_ == 0);
                              auVar216._8_4_ = -(uint)(local_1418._8_4_ == 0);
                              auVar216._12_4_ = -(uint)(local_1418._12_4_ == 0);
                              auVar251 = auVar216 ^ _DAT_01f7ae20;
                              uVar182 = movmskps((int)p_Var166,auVar216);
                              pRVar165 = (RTCRayN *)(ulong)(uVar182 ^ 0xf);
                              if ((uVar182 ^ 0xf) != 0) {
                                uVar182 = *(uint *)(args.hit + 4);
                                uVar183 = *(uint *)(args.hit + 8);
                                uVar184 = *(uint *)(args.hit + 0xc);
                                *(uint *)(args.ray + 0xc0) =
                                     ~auVar216._0_4_ & *(uint *)args.hit |
                                     *(uint *)(args.ray + 0xc0) & auVar216._0_4_;
                                *(uint *)(args.ray + 0xc4) =
                                     ~auVar216._4_4_ & uVar182 |
                                     *(uint *)(args.ray + 0xc4) & auVar216._4_4_;
                                *(uint *)(args.ray + 200) =
                                     ~auVar216._8_4_ & uVar183 |
                                     *(uint *)(args.ray + 200) & auVar216._8_4_;
                                *(uint *)(args.ray + 0xcc) =
                                     ~auVar216._12_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xcc) & auVar216._12_4_;
                                uVar182 = *(uint *)(args.hit + 0x14);
                                uVar183 = *(uint *)(args.hit + 0x18);
                                uVar184 = *(uint *)(args.hit + 0x1c);
                                *(uint *)(args.ray + 0xd0) =
                                     ~auVar216._0_4_ & *(uint *)(args.hit + 0x10) |
                                     *(uint *)(args.ray + 0xd0) & auVar216._0_4_;
                                *(uint *)(args.ray + 0xd4) =
                                     ~auVar216._4_4_ & uVar182 |
                                     *(uint *)(args.ray + 0xd4) & auVar216._4_4_;
                                *(uint *)(args.ray + 0xd8) =
                                     ~auVar216._8_4_ & uVar183 |
                                     *(uint *)(args.ray + 0xd8) & auVar216._8_4_;
                                *(uint *)(args.ray + 0xdc) =
                                     ~auVar216._12_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xdc) & auVar216._12_4_;
                                uVar182 = *(uint *)(args.hit + 0x24);
                                uVar183 = *(uint *)(args.hit + 0x28);
                                uVar184 = *(uint *)(args.hit + 0x2c);
                                *(uint *)(args.ray + 0xe0) =
                                     ~auVar216._0_4_ & *(uint *)(args.hit + 0x20) |
                                     *(uint *)(args.ray + 0xe0) & auVar216._0_4_;
                                *(uint *)(args.ray + 0xe4) =
                                     ~auVar216._4_4_ & uVar182 |
                                     *(uint *)(args.ray + 0xe4) & auVar216._4_4_;
                                *(uint *)(args.ray + 0xe8) =
                                     ~auVar216._8_4_ & uVar183 |
                                     *(uint *)(args.ray + 0xe8) & auVar216._8_4_;
                                *(uint *)(args.ray + 0xec) =
                                     ~auVar216._12_4_ & uVar184 |
                                     *(uint *)(args.ray + 0xec) & auVar216._12_4_;
                                auVar323._0_4_ = *(uint *)(args.ray + 0xf0) & auVar216._0_4_;
                                auVar323._4_4_ = *(uint *)(args.ray + 0xf4) & auVar216._4_4_;
                                auVar323._8_4_ = *(uint *)(args.ray + 0xf8) & auVar216._8_4_;
                                auVar323._12_4_ = *(uint *)(args.ray + 0xfc) & auVar216._12_4_;
                                auVar276._0_4_ = ~auVar216._0_4_ & *(uint *)(args.hit + 0x30);
                                auVar276._4_4_ = ~auVar216._4_4_ & *(uint *)(args.hit + 0x34);
                                auVar276._8_4_ = ~auVar216._8_4_ & *(uint *)(args.hit + 0x38);
                                auVar276._12_4_ = ~auVar216._12_4_ & *(uint *)(args.hit + 0x3c);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar276 | auVar323;
                                uVar182 = *(uint *)(args.hit + 0x44);
                                uVar183 = *(uint *)(args.hit + 0x48);
                                uVar184 = *(uint *)(args.hit + 0x4c);
                                *(uint *)(args.ray + 0x100) =
                                     ~auVar216._0_4_ & *(uint *)(args.hit + 0x40) |
                                     *(uint *)(args.ray + 0x100) & auVar216._0_4_;
                                *(uint *)(args.ray + 0x104) =
                                     ~auVar216._4_4_ & uVar182 |
                                     *(uint *)(args.ray + 0x104) & auVar216._4_4_;
                                *(uint *)(args.ray + 0x108) =
                                     ~auVar216._8_4_ & uVar183 |
                                     *(uint *)(args.ray + 0x108) & auVar216._8_4_;
                                *(uint *)(args.ray + 0x10c) =
                                     ~auVar216._12_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x10c) & auVar216._12_4_;
                                uVar182 = *(uint *)(args.hit + 0x54);
                                uVar183 = *(uint *)(args.hit + 0x58);
                                uVar184 = *(uint *)(args.hit + 0x5c);
                                *(uint *)(args.ray + 0x110) =
                                     *(uint *)(args.ray + 0x110) & auVar216._0_4_ |
                                     ~auVar216._0_4_ & *(uint *)(args.hit + 0x50);
                                *(uint *)(args.ray + 0x114) =
                                     *(uint *)(args.ray + 0x114) & auVar216._4_4_ |
                                     ~auVar216._4_4_ & uVar182;
                                *(uint *)(args.ray + 0x118) =
                                     *(uint *)(args.ray + 0x118) & auVar216._8_4_ |
                                     ~auVar216._8_4_ & uVar183;
                                *(uint *)(args.ray + 0x11c) =
                                     *(uint *)(args.ray + 0x11c) & auVar216._12_4_ |
                                     ~auVar216._12_4_ & uVar184;
                                uVar182 = *(uint *)(args.hit + 100);
                                uVar183 = *(uint *)(args.hit + 0x68);
                                uVar184 = *(uint *)(args.hit + 0x6c);
                                *(uint *)(args.ray + 0x120) =
                                     *(uint *)(args.ray + 0x120) & auVar216._0_4_ |
                                     ~auVar216._0_4_ & *(uint *)(args.hit + 0x60);
                                *(uint *)(args.ray + 0x124) =
                                     *(uint *)(args.ray + 0x124) & auVar216._4_4_ |
                                     ~auVar216._4_4_ & uVar182;
                                *(uint *)(args.ray + 0x128) =
                                     *(uint *)(args.ray + 0x128) & auVar216._8_4_ |
                                     ~auVar216._8_4_ & uVar183;
                                *(uint *)(args.ray + 300) =
                                     *(uint *)(args.ray + 300) & auVar216._12_4_ |
                                     ~auVar216._12_4_ & uVar184;
                                uVar182 = *(uint *)(args.hit + 0x74);
                                uVar183 = *(uint *)(args.hit + 0x78);
                                uVar184 = *(uint *)(args.hit + 0x7c);
                                *(uint *)(args.ray + 0x130) =
                                     ~auVar216._0_4_ & *(uint *)(args.hit + 0x70) |
                                     *(uint *)(args.ray + 0x130) & auVar216._0_4_;
                                *(uint *)(args.ray + 0x134) =
                                     ~auVar216._4_4_ & uVar182 |
                                     *(uint *)(args.ray + 0x134) & auVar216._4_4_;
                                *(uint *)(args.ray + 0x138) =
                                     ~auVar216._8_4_ & uVar183 |
                                     *(uint *)(args.ray + 0x138) & auVar216._8_4_;
                                *(uint *)(args.ray + 0x13c) =
                                     ~auVar216._12_4_ & uVar184 |
                                     *(uint *)(args.ray + 0x13c) & auVar216._12_4_;
                                *(undefined1 (*) [16])(args.ray + 0x140) =
                                     ~auVar216 & *(undefined1 (*) [16])(args.hit + 0x80) |
                                     *(undefined1 (*) [16])(args.ray + 0x140) & auVar216;
                                pRVar165 = args.ray;
                              }
                            }
                            auVar252._0_4_ = auVar251._0_4_ << 0x1f;
                            auVar252._4_4_ = auVar251._4_4_ << 0x1f;
                            auVar252._8_4_ = auVar251._8_4_ << 0x1f;
                            auVar252._12_4_ = auVar251._12_4_ << 0x1f;
                            iVar160 = movmskps((int)pRVar165,auVar252);
                            if (iVar160 == 0) {
                              *(undefined4 *)(ray + k * 4 + 0x80) = local_14d8._0_4_;
                            }
                            else {
                              local_14d8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                              local_14d8._4_4_ = 0;
                              fStack_14d0 = 0.0;
                              fStack_14cc = 0.0;
                            }
                            *(undefined4 *)(local_1418 + lVar178 * 4 + -0x10) = 0;
                            valid.field_0.i[0] =
                                 -(uint)(fVar391 <= (float)local_14d8._0_4_) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(fVar261 <= (float)local_14d8._0_4_) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(fVar334 <= (float)local_14d8._0_4_) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(fVar340 <= (float)local_14d8._0_4_) & valid.field_0.i[3];
                            iVar160 = movmskps(uVar161,(undefined1  [16])valid.field_0);
                            if (iVar160 == 0) break;
                            auVar253._0_4_ = valid.field_0.i[0] & (uint)fVar391;
                            auVar253._4_4_ = valid.field_0.i[1] & (uint)fVar261;
                            auVar253._8_4_ = valid.field_0.i[2] & (uint)fVar334;
                            auVar253._12_4_ = valid.field_0.i[3] & (uint)fVar340;
                            auVar277._0_8_ =
                                 CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                 0x7f8000007f800000;
                            auVar277._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                            auVar277._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                            auVar277 = auVar277 | auVar253;
                            auVar299._4_4_ = auVar277._0_4_;
                            auVar299._0_4_ = auVar277._4_4_;
                            auVar299._8_4_ = auVar277._12_4_;
                            auVar299._12_4_ = auVar277._8_4_;
                            auVar241 = minps(auVar299,auVar277);
                            auVar254._0_8_ = auVar241._8_8_;
                            auVar254._8_4_ = auVar241._0_4_;
                            auVar254._12_4_ = auVar241._4_4_;
                            auVar241 = minps(auVar254,auVar241);
                            auVar255._0_8_ =
                                 CONCAT44(-(uint)(auVar241._4_4_ == auVar277._4_4_) &
                                          valid.field_0.i[1],
                                          -(uint)(auVar241._0_4_ == auVar277._0_4_) &
                                          valid.field_0.i[0]);
                            auVar255._8_4_ =
                                 -(uint)(auVar241._8_4_ == auVar277._8_4_) & valid.field_0.i[2];
                            auVar255._12_4_ =
                                 -(uint)(auVar241._12_4_ == auVar277._12_4_) & valid.field_0.i[3];
                            iVar160 = movmskps(iVar160,auVar255);
                            aVar217 = valid.field_0;
                            if (iVar160 != 0) {
                              aVar217.i[2] = auVar255._8_4_;
                              aVar217._0_8_ = auVar255._0_8_;
                              aVar217.i[3] = auVar255._12_4_;
                            }
                            uVar162 = movmskps(iVar160,(undefined1  [16])aVar217);
                            uVar172 = CONCAT44(uVar167,uVar162);
                            lVar178 = 0;
                            if (uVar172 != 0) {
                              for (; (uVar172 >> lVar178 & 1) == 0; lVar178 = lVar178 + 1) {
                              }
                            }
                          }
                          fVar344 = *(float *)(ray + k * 4 + 0x10);
                          fVar284 = *(float *)(ray + k * 4 + 0x20);
                          fStack_143c = *(float *)(ray + k * 4 + 0x40);
                          local_1488._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                          local_1488._0_4_ = local_1488._4_4_;
                          uStack_1480._0_4_ = (float)local_1488._4_4_;
                          uStack_1480._4_4_ = (float)local_1488._4_4_;
                          local_14d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
                          local_14d8._0_4_ = local_14d8._4_4_;
                          fStack_14d0 = (float)local_14d8._4_4_;
                          fStack_14cc = (float)local_14d8._4_4_;
                          fVar386 = local_1098 - fVar344;
                          fVar302 = fStack_1094 - fVar344;
                          fVar304 = fStack_1090 - fVar344;
                          fVar306 = fStack_108c - fVar344;
                          fVar369 = local_1088 - fVar344;
                          fVar372 = fStack_1084 - fVar344;
                          fVar373 = fStack_1080 - fVar344;
                          fVar374 = fStack_107c - fVar344;
                          fVar396 = (float)local_1078 - fVar284;
                          fVar333 = local_1078._4_4_ - fVar284;
                          fVar339 = fStack_1070 - fVar284;
                          fVar384 = fStack_106c - fVar284;
                          fStack_1354 = fVar302 + fVar372;
                          local_1358 = fVar386 + fVar369;
                          fStack_1350 = fVar304 + fVar373;
                          fStack_134c = fVar306 + fVar374;
                          local_1348 = (local_1068 - fVar284) + fVar396;
                          fStack_1344 = (fStack_1064 - fVar284) + fVar333;
                          fStack_1340 = (fStack_1060 - fVar284) + fVar339;
                          fStack_133c = (fStack_105c - fVar284) + fVar384;
                          local_1438._4_4_ = fStack_1064 - fVar284;
                          local_1438._0_4_ = local_1068 - fVar284;
                          uStack_1430._0_4_ = fStack_1060 - fVar284;
                          uStack_1430._4_4_ = fStack_105c - fVar284;
                        }
                      }
                    }
                  }
                }
                fVar358 = fVar358 - fVar284;
                fVar366 = fVar366 - fVar284;
                fVar364 = 0.0 - fVar284;
                fVar284 = 0.0 - fVar284;
                fVar303 = fVar303 - fVar344;
                fVar305 = fVar305 - fVar344;
                fVar359 = ((fVar359 - fVar380) * fVar332 + fVar380) - fVar344;
                fVar368 = fVar368 - fVar344;
                fVar332 = *(float *)(ray + k * 4);
                fVar356 = fVar356 - fVar332;
                fVar365 = fVar365 - fVar332;
                fVar398 = extraout_XMM0_Dc - fVar332;
                fVar401 = extraout_XMM0_Dd - fVar332;
                fVar261 = (float)local_1258 - fVar332;
                fVar349 = local_1258._4_4_ - fVar332;
                fVar262 = fStack_1250 - fVar332;
                fVar334 = fStack_124c - fVar332;
                fVar375 = local_1248 - fVar332;
                fVar380 = fStack_1244 - fVar332;
                fVar236 = fStack_1240 - fVar332;
                fVar332 = fStack_123c - fVar332;
                fVar350 = fVar375 - fVar356;
                fVar351 = fVar380 - fVar365;
                fVar352 = fVar236 - fVar398;
                fVar353 = fVar332 - fVar401;
                fVar367 = fVar369 - fVar303;
                fVar357 = fVar372 - fVar305;
                fStack_1250 = fVar373 - fVar359;
                fStack_124c = fVar374 - fVar368;
                fVar397 = fVar396 - fVar358;
                fVar381 = fVar333 - fVar366;
                fStack_1240 = fVar339 - fVar364;
                fStack_123c = fVar384 - fVar284;
                fVar343 = fVar386 - fVar369;
                fVar344 = fVar302 - fVar372;
                fVar235 = fVar304 - fVar373;
                fVar338 = fVar306 - fVar374;
                fVar387 = (float)local_1438 - fVar396;
                fVar388 = local_1438._4_4_ - fVar333;
                fVar389 = (float)uStack_1430 - fVar339;
                fVar390 = uStack_1430._4_4_ - fVar384;
                _local_1248 = CONCAT44(fVar381,fVar397);
                fVar400 = fVar356 - fVar261;
                fVar382 = fVar365 - fVar349;
                fVar383 = fVar398 - fVar262;
                fVar385 = fVar401 - fVar334;
                local_1258 = CONCAT44(fVar357,fVar367);
                fVar355 = fVar303 - fVar386;
                fVar361 = fVar305 - fVar302;
                fVar362 = fVar359 - fVar304;
                fVar363 = fVar368 - fVar306;
                fVar354 = fVar358 - (float)local_1438;
                fVar360 = fVar366 - local_1438._4_4_;
                fVar376 = fVar364 - (float)uStack_1430;
                fVar377 = fVar284 - uStack_1430._4_4_;
                fVar378 = (fVar367 * (fVar396 + fVar358) - (fVar369 + fVar303) * fVar397) *
                          fStack_143c +
                          ((fVar375 + fVar356) * fVar397 - (fVar396 + fVar358) * fVar350) *
                          (float)local_1488._0_4_ +
                          (fVar350 * (fVar369 + fVar303) - (fVar375 + fVar356) * fVar367) *
                          (float)local_14d8._0_4_;
                fVar379 = (fVar357 * (fVar333 + fVar366) - (fVar372 + fVar305) * fVar381) *
                          fStack_143c +
                          ((fVar380 + fVar365) * fVar381 - (fVar333 + fVar366) * fVar351) *
                          (float)local_1488._4_4_ +
                          (fVar351 * (fVar372 + fVar305) - (fVar380 + fVar365) * fVar357) *
                          (float)local_14d8._4_4_;
                fVar392 = (fStack_1250 * (fVar339 + fVar364) - (fVar373 + fVar359) * fStack_1240) *
                          fStack_143c +
                          ((fVar236 + fVar398) * fStack_1240 - (fVar339 + fVar364) * fVar352) *
                          (float)uStack_1480 +
                          (fVar352 * (fVar373 + fVar359) - (fVar236 + fVar398) * fStack_1250) *
                          fStack_14d0;
                fVar394 = (fStack_124c * (fVar384 + fVar284) - (fVar374 + fVar368) * fStack_123c) *
                          fStack_143c +
                          ((fVar332 + fVar401) * fStack_123c - (fVar384 + fVar284) * fVar353) *
                          uStack_1480._4_4_ +
                          (fVar353 * (fVar374 + fVar368) - (fVar332 + fVar401) * fStack_124c) *
                          fStack_14cc;
                fVar339 = fVar261 - fVar375;
                fVar340 = fVar349 - fVar380;
                fVar341 = fVar262 - fVar236;
                fVar342 = fVar334 - fVar332;
                auVar270._0_4_ =
                     (fVar355 * ((float)local_1438 + fVar358) - (fVar386 + fVar303) * fVar354) *
                     fStack_143c +
                     ((fVar356 + fVar261) * fVar354 - ((float)local_1438 + fVar358) * fVar400) *
                     (float)local_1488._0_4_ +
                     (fVar400 * (fVar386 + fVar303) - (fVar356 + fVar261) * fVar355) *
                     (float)local_14d8._0_4_;
                auVar270._4_4_ =
                     (fVar361 * (local_1438._4_4_ + fVar366) - (fVar302 + fVar305) * fVar360) *
                     fStack_143c +
                     ((fVar365 + fVar349) * fVar360 - (local_1438._4_4_ + fVar366) * fVar382) *
                     (float)local_1488._4_4_ +
                     (fVar382 * (fVar302 + fVar305) - (fVar365 + fVar349) * fVar361) *
                     (float)local_14d8._4_4_;
                auVar270._8_4_ =
                     (fVar362 * ((float)uStack_1430 + fVar364) - (fVar304 + fVar359) * fVar376) *
                     fStack_143c +
                     ((fVar398 + fVar262) * fVar376 - ((float)uStack_1430 + fVar364) * fVar383) *
                     (float)uStack_1480 +
                     (fVar383 * (fVar304 + fVar359) - (fVar398 + fVar262) * fVar362) * fStack_14d0;
                auVar270._12_4_ =
                     (fVar363 * (uStack_1430._4_4_ + fVar284) - (fVar306 + fVar368) * fVar377) *
                     fStack_143c +
                     ((fVar401 + fVar334) * fVar377 - (uStack_1430._4_4_ + fVar284) * fVar385) *
                     uStack_1480._4_4_ +
                     (fVar385 * (fVar306 + fVar368) - (fVar401 + fVar334) * fVar363) * fStack_14cc;
                auVar246._0_4_ =
                     (fVar343 * local_1348 - local_1358 * fVar387) * fStack_143c +
                     ((fVar375 + fVar261) * fVar387 - local_1348 * fVar339) *
                     (float)local_1488._0_4_ +
                     (fVar339 * local_1358 - (fVar375 + fVar261) * fVar343) *
                     (float)local_14d8._0_4_;
                auVar246._4_4_ =
                     (fVar344 * fStack_1344 - fStack_1354 * fVar388) * fStack_143c +
                     ((fVar380 + fVar349) * fVar388 - fStack_1344 * fVar340) *
                     (float)local_1488._4_4_ +
                     (fVar340 * fStack_1354 - (fVar380 + fVar349) * fVar344) *
                     (float)local_14d8._4_4_;
                auVar246._8_4_ =
                     (fVar235 * fStack_1340 - fStack_1350 * fVar389) * fStack_143c +
                     ((fVar236 + fVar262) * fVar389 - fStack_1340 * fVar341) * (float)uStack_1480 +
                     (fVar341 * fStack_1350 - (fVar236 + fVar262) * fVar235) * fStack_14d0;
                auVar246._12_4_ =
                     (fVar338 * fStack_133c - fStack_134c * fVar390) * fStack_143c +
                     ((fVar332 + fVar334) * fVar390 - fStack_133c * fVar342) * uStack_1480._4_4_ +
                     (fVar342 * fStack_134c - (fVar332 + fVar334) * fVar338) * fStack_14cc;
                auVar312._0_4_ = fVar378 + auVar270._0_4_ + auVar246._0_4_;
                auVar312._4_4_ = fVar379 + auVar270._4_4_ + auVar246._4_4_;
                auVar312._8_4_ = fVar392 + auVar270._8_4_ + auVar246._8_4_;
                auVar312._12_4_ = fVar394 + auVar270._12_4_ + auVar246._12_4_;
                uVar172 = CONCAT44(auVar312._4_4_,auVar312._0_4_);
                auVar346._4_4_ = fVar379;
                auVar346._0_4_ = fVar378;
                auVar346._8_4_ = fVar392;
                auVar346._12_4_ = fVar394;
                auVar241 = minps(auVar346,auVar270);
                auVar237 = minps(auVar241,auVar246);
                auVar212._4_4_ = fVar379;
                auVar212._0_4_ = fVar378;
                auVar212._8_4_ = fVar392;
                auVar212._12_4_ = fVar394;
                auVar241 = maxps(auVar212,auVar270);
                auVar241 = maxps(auVar241,auVar246);
                fVar332 = ABS(auVar312._8_4_) * 1.1920929e-07;
                fVar375 = ABS(auVar312._12_4_) * 1.1920929e-07;
                auVar213._4_4_ = -(uint)(auVar241._4_4_ <= ABS(auVar312._4_4_) * 1.1920929e-07);
                auVar213._0_4_ = -(uint)(auVar241._0_4_ <= ABS(auVar312._0_4_) * 1.1920929e-07);
                auVar213._8_4_ = -(uint)(auVar241._8_4_ <= fVar332);
                auVar213._12_4_ = -(uint)(auVar241._12_4_ <= fVar375);
                auVar347._4_4_ = -(uint)(-(ABS(auVar312._4_4_) * 1.1920929e-07) <= auVar237._4_4_);
                auVar347._0_4_ = -(uint)(-(ABS(auVar312._0_4_) * 1.1920929e-07) <= auVar237._0_4_);
                auVar347._8_4_ = -(uint)(-fVar332 <= auVar237._8_4_);
                auVar347._12_4_ = -(uint)(-fVar375 <= auVar237._12_4_);
                auVar213 = auVar213 | auVar347;
                iVar160 = movmskps(uVar161,auVar213);
                auVar241 = local_11a8;
                fVar375 = local_10a8;
                fVar236 = fStack_10a4;
                fVar396 = fStack_10a0;
                fVar261 = fStack_109c;
                fVar349 = local_1198;
                fVar262 = fStack_1194;
                fVar333 = fStack_1190;
                fVar334 = fStack_118c;
                fVar380 = local_10b8;
                fVar283 = fStack_10b4;
                fVar384 = fStack_10b0;
                fVar369 = fStack_10ac;
                fVar386 = local_10c8;
                fVar372 = fStack_10c4;
                fVar373 = fStack_10c0;
                fVar374 = fStack_10bc;
                fVar391 = local_10d8;
                fVar302 = fStack_10d4;
                fVar304 = fStack_10d0;
                fVar306 = fStack_10cc;
                if (iVar160 != 0) {
                  uVar182 = -(uint)(ABS(fVar343 * fVar354) <= ABS(fVar355 * fVar397));
                  uVar185 = -(uint)(ABS(fVar344 * fVar360) <= ABS(fVar361 * fVar381));
                  uVar188 = -(uint)(ABS(fVar235 * fVar376) <= ABS(fVar362 * fStack_1240));
                  uVar191 = -(uint)(ABS(fVar338 * fVar377) <= ABS(fVar363 * fStack_123c));
                  uVar183 = -(uint)(ABS(fVar400 * fVar387) <= ABS(fVar350 * fVar354));
                  uVar186 = -(uint)(ABS(fVar382 * fVar388) <= ABS(fVar351 * fVar360));
                  uVar189 = -(uint)(ABS(fVar383 * fVar389) <= ABS(fVar352 * fVar376));
                  uVar192 = -(uint)(ABS(fVar385 * fVar390) <= ABS(fVar353 * fVar377));
                  uVar184 = -(uint)(ABS(fVar339 * fVar355) <= ABS(fVar400 * fVar367));
                  uVar187 = -(uint)(ABS(fVar340 * fVar361) <= ABS(fVar382 * fVar357));
                  uVar190 = -(uint)(ABS(fVar341 * fVar362) <= ABS(fVar383 * fStack_1250));
                  uVar193 = -(uint)(ABS(fVar342 * fVar363) <= ABS(fVar385 * fStack_124c));
                  fVar393 = (float)(~uVar182 & (uint)(fVar367 * fVar354 - fVar355 * fVar397) |
                                   (uint)(fVar355 * fVar387 - fVar343 * fVar354) & uVar182);
                  fVar395 = (float)(~uVar185 & (uint)(fVar357 * fVar360 - fVar361 * fVar381) |
                                   (uint)(fVar361 * fVar388 - fVar344 * fVar360) & uVar185);
                  fVar399 = (float)(~uVar188 & (uint)(fStack_1250 * fVar376 - fVar362 * fStack_1240)
                                   | (uint)(fVar362 * fVar389 - fVar235 * fVar376) & uVar188);
                  fVar402 = (float)(~uVar191 & (uint)(fStack_124c * fVar377 - fVar363 * fStack_123c)
                                   | (uint)(fVar363 * fVar390 - fVar338 * fVar377) & uVar191);
                  fVar354 = (float)(~uVar183 & (uint)(fVar397 * fVar400 - fVar350 * fVar354) |
                                   (uint)(fVar339 * fVar354 - fVar400 * fVar387) & uVar183);
                  fVar360 = (float)(~uVar186 & (uint)(fVar381 * fVar382 - fVar351 * fVar360) |
                                   (uint)(fVar340 * fVar360 - fVar382 * fVar388) & uVar186);
                  fVar376 = (float)(~uVar189 & (uint)(fStack_1240 * fVar383 - fVar352 * fVar376) |
                                   (uint)(fVar341 * fVar376 - fVar383 * fVar389) & uVar189);
                  fVar377 = (float)(~uVar192 & (uint)(fStack_123c * fVar385 - fVar353 * fVar377) |
                                   (uint)(fVar342 * fVar377 - fVar385 * fVar390) & uVar192);
                  fVar339 = (float)(~uVar184 & (uint)(fVar350 * fVar355 - fVar400 * fVar367) |
                                   (uint)(fVar400 * fVar343 - fVar339 * fVar355) & uVar184);
                  fVar340 = (float)(~uVar187 & (uint)(fVar351 * fVar361 - fVar382 * fVar357) |
                                   (uint)(fVar382 * fVar344 - fVar340 * fVar361) & uVar187);
                  fVar341 = (float)(~uVar190 & (uint)(fVar352 * fVar362 - fVar383 * fStack_1250) |
                                   (uint)(fVar383 * fVar235 - fVar341 * fVar362) & uVar190);
                  fVar338 = (float)(~uVar193 & (uint)(fVar353 * fVar363 - fVar385 * fStack_124c) |
                                   (uint)(fVar385 * fVar338 - fVar342 * fVar363) & uVar193);
                  fVar332 = fStack_143c * fVar393 +
                            (float)local_1488._0_4_ * fVar354 + (float)local_14d8._0_4_ * fVar339;
                  fVar343 = fStack_143c * fVar395 +
                            (float)local_1488._4_4_ * fVar360 + (float)local_14d8._4_4_ * fVar340;
                  fVar344 = fStack_143c * fVar399 +
                            (float)uStack_1480 * fVar376 + fStack_14d0 * fVar341;
                  fVar235 = fStack_143c * fVar402 +
                            uStack_1480._4_4_ * fVar377 + fStack_14cc * fVar338;
                  auVar320._0_4_ = fVar332 + fVar332;
                  auVar320._4_4_ = fVar343 + fVar343;
                  auVar320._8_4_ = fVar344 + fVar344;
                  auVar320._12_4_ = fVar235 + fVar235;
                  auVar271._0_4_ = fVar358 * fVar339;
                  auVar271._4_4_ = fVar366 * fVar340;
                  auVar271._8_4_ = fVar364 * fVar341;
                  auVar271._12_4_ = fVar284 * fVar338;
                  auVar247._0_4_ = fVar303 * fVar354 + auVar271._0_4_;
                  auVar247._4_4_ = fVar305 * fVar360 + auVar271._4_4_;
                  auVar247._8_4_ = fVar359 * fVar376 + auVar271._8_4_;
                  auVar247._12_4_ = fVar368 * fVar377 + auVar271._12_4_;
                  fVar359 = fVar356 * fVar393 + auVar247._0_4_;
                  fVar303 = fVar365 * fVar395 + auVar247._4_4_;
                  fVar305 = fVar398 * fVar399 + auVar247._8_4_;
                  fVar368 = fVar401 * fVar402 + auVar247._12_4_;
                  auVar237 = rcpps(auVar247,auVar320);
                  fVar332 = auVar237._0_4_;
                  fVar343 = auVar237._4_4_;
                  fVar344 = auVar237._8_4_;
                  fVar284 = auVar237._12_4_;
                  auVar329._0_4_ =
                       ((1.0 - auVar320._0_4_ * fVar332) * fVar332 + fVar332) * (fVar359 + fVar359);
                  auVar329._4_4_ =
                       ((1.0 - auVar320._4_4_ * fVar343) * fVar343 + fVar343) * (fVar303 + fVar303);
                  auVar329._8_4_ =
                       ((1.0 - auVar320._8_4_ * fVar344) * fVar344 + fVar344) * (fVar305 + fVar305);
                  auVar329._12_4_ =
                       ((1.0 - auVar320._12_4_ * fVar284) * fVar284 + fVar284) * (fVar368 + fVar368)
                  ;
                  fVar343 = *(float *)(ray + k * 4 + 0x80);
                  fVar332 = *(float *)(ray + k * 4 + 0x30);
                  auVar248._0_4_ =
                       -(uint)(auVar329._0_4_ <= fVar343 && fVar332 <= auVar329._0_4_) &
                       auVar213._0_4_;
                  auVar248._4_4_ =
                       -(uint)(auVar329._4_4_ <= fVar343 && fVar332 <= auVar329._4_4_) &
                       auVar213._4_4_;
                  auVar248._8_4_ =
                       -(uint)(auVar329._8_4_ <= fVar343 && fVar332 <= auVar329._8_4_) &
                       auVar213._8_4_;
                  auVar248._12_4_ =
                       -(uint)(auVar329._12_4_ <= fVar343 && fVar332 <= auVar329._12_4_) &
                       auVar213._12_4_;
                  iVar160 = movmskps(uVar161,auVar248);
                  if (iVar160 != 0) {
                    aVar249._0_4_ = auVar248._0_4_ & -(uint)(auVar320._0_4_ != 0.0);
                    aVar249._4_4_ = auVar248._4_4_ & -(uint)(auVar320._4_4_ != 0.0);
                    aVar249._8_4_ = auVar248._8_4_ & -(uint)(auVar320._8_4_ != 0.0);
                    aVar249._12_4_ = auVar248._12_4_ & -(uint)(auVar320._12_4_ != 0.0);
                    iVar160 = movmskps(iVar160,(undefined1  [16])aVar249);
                    if (iVar160 != 0) {
                      _local_12b8 = auVar329;
                      local_12a8[0] = fVar393;
                      local_12a8[1] = fVar395;
                      local_12a8[2] = fVar399;
                      local_12a8[3] = fVar402;
                      local_1298._4_4_ = fVar360;
                      local_1298._0_4_ = fVar354;
                      fStack_1290 = fVar376;
                      fStack_128c = fVar377;
                      local_1288[0] = fVar339;
                      local_1288[1] = fVar340;
                      local_1288[2] = fVar341;
                      local_1288[3] = fVar338;
                      auVar297._0_4_ = auVar312._0_4_ - auVar270._0_4_;
                      auVar297._4_4_ = auVar312._4_4_ - auVar270._4_4_;
                      auVar297._8_4_ = auVar312._8_4_ - auVar270._8_4_;
                      auVar297._12_4_ = auVar312._12_4_ - auVar270._12_4_;
                      auVar272._4_12_ = auVar271._4_12_;
                      auVar272._0_4_ = (float)(int)(*(ushort *)(lVar20 + 8 + lVar179) - 1);
                      auVar321._4_4_ = auVar271._4_4_;
                      auVar321._0_4_ = auVar272._0_4_;
                      auVar321._8_4_ = auVar271._8_4_;
                      auVar321._12_4_ = auVar271._12_4_;
                      auVar237 = rcpss(auVar321,auVar272);
                      fVar332 = (2.0 - auVar272._0_4_ * auVar237._0_4_) * auVar237._0_4_;
                      auVar322._4_12_ = auVar237._4_12_;
                      auVar322._0_4_ = (float)(int)(*(ushort *)(lVar20 + 10 + lVar179) - 1);
                      auVar348._4_4_ = auVar237._4_4_;
                      auVar348._0_4_ = auVar322._0_4_;
                      auVar348._8_4_ = auVar237._8_4_;
                      auVar348._12_4_ = auVar237._12_4_;
                      auVar237 = rcpss(auVar348,auVar322);
                      fVar344 = (2.0 - auVar322._0_4_ * auVar237._0_4_) * auVar237._0_4_;
                      tNear.field_0.v[0] =
                           fVar332 * ((float)sx.field_0.i[0] * auVar312._0_4_ +
                                     (auVar312._0_4_ - fVar378));
                      tNear.field_0.v[1] =
                           fVar332 * ((float)(sx.field_0.i[1] + 1) * auVar312._4_4_ +
                                     (auVar312._4_4_ - fVar379));
                      tNear.field_0.v[2] =
                           fVar332 * ((float)(sx.field_0.i[2] + 1) * auVar312._8_4_ +
                                     (auVar312._8_4_ - fVar392));
                      tNear.field_0.v[3] =
                           fVar332 * ((float)sx.field_0.i[3] * auVar312._12_4_ +
                                     (auVar312._12_4_ - fVar394));
                      pGVar19 = (context->scene->geometries).items[uVar177].ptr;
                      if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar237 = rcpps(auVar297,auVar312);
                        fVar332 = auVar237._0_4_;
                        fVar284 = auVar237._4_4_;
                        fVar359 = auVar237._8_4_;
                        fVar303 = auVar237._12_4_;
                        local_1458 = (float)(uVar172 & 0x7fffffff7fffffff);
                        fStack_1454 = (float)((uVar172 & 0x7fffffff7fffffff) >> 0x20);
                        fVar332 = (float)(-(uint)(1e-18 <= local_1458) &
                                         (uint)(((float)DAT_01f7ba10 - auVar312._0_4_ * fVar332) *
                                                fVar332 + fVar332));
                        fVar284 = (float)(-(uint)(1e-18 <= fStack_1454) &
                                         (uint)((DAT_01f7ba10._4_4_ - auVar312._4_4_ * fVar284) *
                                                fVar284 + fVar284));
                        fVar359 = (float)(-(uint)(1e-18 <= ABS(auVar312._8_4_)) &
                                         (uint)((DAT_01f7ba10._8_4_ - auVar312._8_4_ * fVar359) *
                                                fVar359 + fVar359));
                        fVar303 = (float)(-(uint)(1e-18 <= ABS(auVar312._12_4_)) &
                                         (uint)((DAT_01f7ba10._12_4_ - auVar312._12_4_ * fVar303) *
                                                fVar303 + fVar303));
                        auVar214._0_4_ = tNear.field_0.v[0] * fVar332;
                        auVar214._4_4_ = tNear.field_0.v[1] * fVar284;
                        auVar214._8_4_ = tNear.field_0.v[2] * fVar359;
                        auVar214._12_4_ = tNear.field_0.v[3] * fVar303;
                        local_12d8 = minps(auVar214,_DAT_01f7ba10);
                        auVar273._0_4_ =
                             fVar344 * ((float)sy.field_0.i[1] * auVar312._0_4_ + auVar297._0_4_) *
                             fVar332;
                        auVar273._4_4_ =
                             fVar344 * ((float)sy.field_0.i[1] * auVar312._4_4_ + auVar297._4_4_) *
                             fVar284;
                        auVar273._8_4_ =
                             fVar344 * ((float)(sy.field_0.i[1] + 1) * auVar312._8_4_ +
                                       auVar297._8_4_) * fVar359;
                        auVar273._12_4_ =
                             fVar344 * ((float)(sy.field_0.i[1] + 1) * auVar312._12_4_ +
                                       auVar297._12_4_) * fVar303;
                        local_12c8 = minps(auVar273,_DAT_01f7ba10);
                        auVar330._0_4_ = (uint)auVar329._0_4_ & aVar249._0_4_;
                        auVar330._4_4_ = (uint)auVar329._4_4_ & aVar249._4_4_;
                        auVar330._8_4_ = (uint)auVar329._8_4_ & aVar249._8_4_;
                        auVar330._12_4_ = (uint)auVar329._12_4_ & aVar249._12_4_;
                        auVar274._0_8_ =
                             CONCAT44(~aVar249._4_4_,~aVar249._0_4_) & 0x7f8000007f800000;
                        auVar274._8_4_ = ~aVar249._8_4_ & 0x7f800000;
                        auVar274._12_4_ = ~aVar249._12_4_ & 0x7f800000;
                        auVar274 = auVar274 | auVar330;
                        auVar298._4_4_ = auVar274._0_4_;
                        auVar298._0_4_ = auVar274._4_4_;
                        auVar298._8_4_ = auVar274._12_4_;
                        auVar298._12_4_ = auVar274._8_4_;
                        auVar237 = minps(auVar298,auVar274);
                        auVar215._0_8_ = auVar237._8_8_;
                        auVar215._8_4_ = auVar237._0_4_;
                        auVar215._12_4_ = auVar237._4_4_;
                        auVar237 = minps(auVar215,auVar237);
                        uVar186 = -(uint)(auVar237._0_4_ == auVar274._0_4_);
                        uVar187 = -(uint)(auVar237._4_4_ == auVar274._4_4_);
                        uVar188 = -(uint)(auVar237._8_4_ == auVar274._8_4_);
                        uVar189 = -(uint)(auVar237._12_4_ == auVar274._12_4_);
                        auVar275._0_4_ = uVar186 & aVar249._0_4_;
                        auVar275._4_4_ = uVar187 & aVar249._4_4_;
                        auVar275._8_4_ = uVar188 & aVar249._8_4_;
                        auVar275._12_4_ = uVar189 & aVar249._12_4_;
                        iVar160 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar275);
                        uVar182 = 0xffffffff;
                        uVar183 = 0xffffffff;
                        uVar184 = 0xffffffff;
                        uVar185 = 0xffffffff;
                        if (iVar160 != 0) {
                          uVar182 = uVar186;
                          uVar183 = uVar187;
                          uVar184 = uVar188;
                          uVar185 = uVar189;
                        }
                        auVar250._0_4_ = aVar249._0_4_ & uVar182;
                        auVar250._4_4_ = aVar249._4_4_ & uVar183;
                        auVar250._8_4_ = aVar249._8_4_ & uVar184;
                        auVar250._12_4_ = aVar249._12_4_ & uVar185;
                        uVar182 = movmskps(iVar160,auVar250);
                        lVar178 = 0;
                        if (uVar182 != 0) {
                          for (; (uVar182 >> lVar178 & 1) == 0; lVar178 = lVar178 + 1) {
                          }
                        }
                        valid.field_0 = aVar249;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar161 = *(undefined4 *)(local_12d8 + lVar178 * 4);
                          uVar167 = *(undefined4 *)(local_12c8 + lVar178 * 4);
                          fVar332 = local_12a8[lVar178];
                          fVar343 = local_1288[lVar178 + -4];
                          fVar344 = local_1288[lVar178];
                          *(float *)(ray + k * 4 + 0x80) = local_12a8[lVar178 + -4];
                          *(float *)(ray + k * 4 + 0xc0) = fVar332;
                          *(float *)(ray + k * 4 + 0xd0) = fVar343;
                          *(float *)(ray + k * 4 + 0xe0) = fVar344;
                          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar161;
                          *(undefined4 *)(ray + k * 4 + 0x100) = uVar167;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_1400;
                          *(uint *)(ray + k * 4 + 0x120) = uVar170;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_14b8 = CONCAT44(local_11b8._0_4_,local_11b8._0_4_);
                          uStack_14b0._0_4_ = local_11b8._0_4_;
                          uStack_14b0._4_4_ = local_11b8._0_4_;
                          local_1488._4_4_ = local_11c8._0_4_;
                          local_1488._0_4_ = local_11c8._0_4_;
                          uStack_1480._0_4_ = (float)local_11c8._0_4_;
                          uStack_1480._4_4_ = (float)local_11c8._0_4_;
                          auVar141 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar163);
                          uStack_148c = (undefined4)
                                        ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar163 + 8) >>
                                        0x20);
                          while( true ) {
                            local_1148 = *(undefined4 *)(local_12d8 + lVar178 * 4);
                            uVar162 = *(undefined4 *)(local_12c8 + lVar178 * 4);
                            *(float *)(ray + k * 4 + 0x80) = local_12a8[lVar178 + -4];
                            args.context = context->user;
                            local_1138._4_4_ = uVar162;
                            local_1138._0_4_ = uVar162;
                            local_1138._8_4_ = uVar162;
                            local_1138._12_4_ = uVar162;
                            local_1178 = local_12a8[lVar178];
                            fVar332 = local_1288[lVar178 + -4];
                            fVar344 = local_1288[lVar178];
                            local_1168._4_4_ = fVar332;
                            local_1168._0_4_ = fVar332;
                            fStack_1160 = fVar332;
                            fStack_115c = fVar332;
                            local_1158._4_4_ = fVar344;
                            local_1158._0_4_ = fVar344;
                            fStack_1150 = fVar344;
                            fStack_114c = fVar344;
                            fStack_1174 = local_1178;
                            fStack_1170 = local_1178;
                            fStack_116c = local_1178;
                            uStack_1144 = local_1148;
                            uStack_1140 = local_1148;
                            uStack_113c = local_1148;
                            local_1128 = local_1488;
                            uStack_1120 = uStack_1480;
                            local_1118 = local_14b8;
                            uStack_1110 = uStack_14b0;
                            local_1108 = (args.context)->instID[0];
                            uStack_1104 = local_1108;
                            uStack_1100 = local_1108;
                            uStack_10fc = local_1108;
                            local_10f8 = (args.context)->instPrimID[0];
                            uStack_10f4 = local_10f8;
                            uStack_10f0 = local_10f8;
                            uStack_10ec = local_10f8;
                            local_1418._12_4_ = uStack_148c;
                            local_1418._0_12_ = auVar141;
                            args.valid = (int *)local_1418;
                            args.geometryUserPtr = pGVar19->userPtr;
                            args.ray = (RTCRayN *)ray;
                            args.hit = (RTCHitN *)&local_1178;
                            args.N = 4;
                            p_Var166 = pGVar19->intersectionFilterN;
                            if (p_Var166 != (RTCFilterFunctionN)0x0) {
                              p_Var166 = (RTCFilterFunctionN)(*p_Var166)(&args);
                            }
                            auVar256._0_4_ = -(uint)(local_1418._0_4_ == 0);
                            auVar256._4_4_ = -(uint)(local_1418._4_4_ == 0);
                            auVar256._8_4_ = -(uint)(local_1418._8_4_ == 0);
                            auVar256._12_4_ = -(uint)(local_1418._12_4_ == 0);
                            uVar170 = movmskps((int)p_Var166,auVar256);
                            pRVar165 = (RTCRayN *)(ulong)(uVar170 ^ 0xf);
                            if ((uVar170 ^ 0xf) == 0) {
                              auVar256 = auVar256 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var166 = context->args->filter;
                              if ((p_Var166 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                                p_Var166 = (RTCFilterFunctionN)(*p_Var166)(&args);
                              }
                              auVar218._0_4_ = -(uint)(local_1418._0_4_ == 0);
                              auVar218._4_4_ = -(uint)(local_1418._4_4_ == 0);
                              auVar218._8_4_ = -(uint)(local_1418._8_4_ == 0);
                              auVar218._12_4_ = -(uint)(local_1418._12_4_ == 0);
                              auVar256 = auVar218 ^ _DAT_01f7ae20;
                              uVar170 = movmskps((int)p_Var166,auVar218);
                              pRVar165 = (RTCRayN *)(ulong)(uVar170 ^ 0xf);
                              if ((uVar170 ^ 0xf) != 0) {
                                auVar278._0_4_ = *(uint *)(args.ray + 0xc0) & auVar218._0_4_;
                                auVar278._4_4_ = *(uint *)(args.ray + 0xc4) & auVar218._4_4_;
                                auVar278._8_4_ = *(uint *)(args.ray + 200) & auVar218._8_4_;
                                auVar278._12_4_ = *(uint *)(args.ray + 0xcc) & auVar218._12_4_;
                                auVar331._0_4_ = ~auVar218._0_4_ & *(uint *)args.hit;
                                auVar331._4_4_ = ~auVar218._4_4_ & *(uint *)(args.hit + 4);
                                auVar331._8_4_ = ~auVar218._8_4_ & *(uint *)(args.hit + 8);
                                auVar331._12_4_ = ~auVar218._12_4_ & *(uint *)(args.hit + 0xc);
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar331 | auVar278;
                                uVar170 = *(uint *)(args.hit + 0x14);
                                uVar182 = *(uint *)(args.hit + 0x18);
                                uVar183 = *(uint *)(args.hit + 0x1c);
                                *(uint *)(args.ray + 0xd0) =
                                     ~auVar218._0_4_ & *(uint *)(args.hit + 0x10) |
                                     *(uint *)(args.ray + 0xd0) & auVar218._0_4_;
                                *(uint *)(args.ray + 0xd4) =
                                     ~auVar218._4_4_ & uVar170 |
                                     *(uint *)(args.ray + 0xd4) & auVar218._4_4_;
                                *(uint *)(args.ray + 0xd8) =
                                     ~auVar218._8_4_ & uVar182 |
                                     *(uint *)(args.ray + 0xd8) & auVar218._8_4_;
                                *(uint *)(args.ray + 0xdc) =
                                     ~auVar218._12_4_ & uVar183 |
                                     *(uint *)(args.ray + 0xdc) & auVar218._12_4_;
                                auVar313._0_4_ = *(uint *)(args.ray + 0xe0) & auVar218._0_4_;
                                auVar313._4_4_ = *(uint *)(args.ray + 0xe4) & auVar218._4_4_;
                                auVar313._8_4_ = *(uint *)(args.ray + 0xe8) & auVar218._8_4_;
                                auVar313._12_4_ = *(uint *)(args.ray + 0xec) & auVar218._12_4_;
                                auVar279._0_4_ = ~auVar218._0_4_ & *(uint *)(args.hit + 0x20);
                                auVar279._4_4_ = ~auVar218._4_4_ & *(uint *)(args.hit + 0x24);
                                auVar279._8_4_ = ~auVar218._8_4_ & *(uint *)(args.hit + 0x28);
                                auVar279._12_4_ = ~auVar218._12_4_ & *(uint *)(args.hit + 0x2c);
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar279 | auVar313;
                                auVar324._0_4_ = *(uint *)(args.ray + 0xf0) & auVar218._0_4_;
                                auVar324._4_4_ = *(uint *)(args.ray + 0xf4) & auVar218._4_4_;
                                auVar324._8_4_ = *(uint *)(args.ray + 0xf8) & auVar218._8_4_;
                                auVar324._12_4_ = *(uint *)(args.ray + 0xfc) & auVar218._12_4_;
                                auVar280._0_4_ = ~auVar218._0_4_ & *(uint *)(args.hit + 0x30);
                                auVar280._4_4_ = ~auVar218._4_4_ & *(uint *)(args.hit + 0x34);
                                auVar280._8_4_ = ~auVar218._8_4_ & *(uint *)(args.hit + 0x38);
                                auVar280._12_4_ = ~auVar218._12_4_ & *(uint *)(args.hit + 0x3c);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar280 | auVar324;
                                uVar170 = *(uint *)(args.hit + 0x44);
                                uVar182 = *(uint *)(args.hit + 0x48);
                                uVar183 = *(uint *)(args.hit + 0x4c);
                                *(uint *)(args.ray + 0x100) =
                                     ~auVar218._0_4_ & *(uint *)(args.hit + 0x40) |
                                     *(uint *)(args.ray + 0x100) & auVar218._0_4_;
                                *(uint *)(args.ray + 0x104) =
                                     ~auVar218._4_4_ & uVar170 |
                                     *(uint *)(args.ray + 0x104) & auVar218._4_4_;
                                *(uint *)(args.ray + 0x108) =
                                     ~auVar218._8_4_ & uVar182 |
                                     *(uint *)(args.ray + 0x108) & auVar218._8_4_;
                                *(uint *)(args.ray + 0x10c) =
                                     ~auVar218._12_4_ & uVar183 |
                                     *(uint *)(args.ray + 0x10c) & auVar218._12_4_;
                                uVar170 = *(uint *)(args.hit + 0x54);
                                uVar182 = *(uint *)(args.hit + 0x58);
                                uVar183 = *(uint *)(args.hit + 0x5c);
                                *(uint *)(args.ray + 0x110) =
                                     *(uint *)(args.ray + 0x110) & auVar218._0_4_ |
                                     ~auVar218._0_4_ & *(uint *)(args.hit + 0x50);
                                *(uint *)(args.ray + 0x114) =
                                     *(uint *)(args.ray + 0x114) & auVar218._4_4_ |
                                     ~auVar218._4_4_ & uVar170;
                                *(uint *)(args.ray + 0x118) =
                                     *(uint *)(args.ray + 0x118) & auVar218._8_4_ |
                                     ~auVar218._8_4_ & uVar182;
                                *(uint *)(args.ray + 0x11c) =
                                     *(uint *)(args.ray + 0x11c) & auVar218._12_4_ |
                                     ~auVar218._12_4_ & uVar183;
                                uVar170 = *(uint *)(args.hit + 100);
                                uVar182 = *(uint *)(args.hit + 0x68);
                                uVar183 = *(uint *)(args.hit + 0x6c);
                                *(uint *)(args.ray + 0x120) =
                                     *(uint *)(args.ray + 0x120) & auVar218._0_4_ |
                                     ~auVar218._0_4_ & *(uint *)(args.hit + 0x60);
                                *(uint *)(args.ray + 0x124) =
                                     *(uint *)(args.ray + 0x124) & auVar218._4_4_ |
                                     ~auVar218._4_4_ & uVar170;
                                *(uint *)(args.ray + 0x128) =
                                     *(uint *)(args.ray + 0x128) & auVar218._8_4_ |
                                     ~auVar218._8_4_ & uVar182;
                                *(uint *)(args.ray + 300) =
                                     *(uint *)(args.ray + 300) & auVar218._12_4_ |
                                     ~auVar218._12_4_ & uVar183;
                                auVar281._0_4_ = *(uint *)(args.ray + 0x130) & auVar218._0_4_;
                                auVar281._4_4_ = *(uint *)(args.ray + 0x134) & auVar218._4_4_;
                                auVar281._8_4_ = *(uint *)(args.ray + 0x138) & auVar218._8_4_;
                                auVar281._12_4_ = *(uint *)(args.ray + 0x13c) & auVar218._12_4_;
                                auVar300._0_4_ = ~auVar218._0_4_ & *(uint *)(args.hit + 0x70);
                                auVar300._4_4_ = ~auVar218._4_4_ & *(uint *)(args.hit + 0x74);
                                auVar300._8_4_ = ~auVar218._8_4_ & *(uint *)(args.hit + 0x78);
                                auVar300._12_4_ = ~auVar218._12_4_ & *(uint *)(args.hit + 0x7c);
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar300 | auVar281;
                                *(undefined1 (*) [16])(args.ray + 0x140) =
                                     ~auVar218 & *(undefined1 (*) [16])(args.hit + 0x80) |
                                     *(undefined1 (*) [16])(args.ray + 0x140) & auVar218;
                                pRVar165 = args.ray;
                              }
                            }
                            auVar257._0_4_ = auVar256._0_4_ << 0x1f;
                            auVar257._4_4_ = auVar256._4_4_ << 0x1f;
                            auVar257._8_4_ = auVar256._8_4_ << 0x1f;
                            auVar257._12_4_ = auVar256._12_4_ << 0x1f;
                            iVar160 = movmskps((int)pRVar165,auVar257);
                            if (iVar160 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar343;
                            }
                            else {
                              fVar343 = *(float *)(ray + k * 4 + 0x80);
                            }
                            *(undefined4 *)(local_1418 + lVar178 * 4 + -0x10) = 0;
                            valid.field_0.i[0] =
                                 -(uint)(auVar329._0_4_ <= fVar343) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(auVar329._4_4_ <= fVar343) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(auVar329._8_4_ <= fVar343) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(auVar329._12_4_ <= fVar343) & valid.field_0.i[3];
                            iVar160 = movmskps(uVar161,(undefined1  [16])valid.field_0);
                            auVar241 = local_11a8;
                            fVar375 = local_10a8;
                            fVar236 = fStack_10a4;
                            fVar396 = fStack_10a0;
                            fVar261 = fStack_109c;
                            fVar349 = local_1198;
                            fVar262 = fStack_1194;
                            fVar333 = fStack_1190;
                            fVar334 = fStack_118c;
                            fVar380 = local_10b8;
                            fVar283 = fStack_10b4;
                            fVar384 = fStack_10b0;
                            fVar369 = fStack_10ac;
                            fVar386 = local_10c8;
                            fVar372 = fStack_10c4;
                            fVar373 = fStack_10c0;
                            fVar374 = fStack_10bc;
                            fVar391 = local_10d8;
                            fVar302 = fStack_10d4;
                            fVar304 = fStack_10d0;
                            fVar306 = fStack_10cc;
                            if (iVar160 == 0) break;
                            auVar258._0_4_ = valid.field_0.i[0] & (uint)auVar329._0_4_;
                            auVar258._4_4_ = valid.field_0.i[1] & (uint)auVar329._4_4_;
                            auVar258._8_4_ = valid.field_0.i[2] & (uint)auVar329._8_4_;
                            auVar258._12_4_ = valid.field_0.i[3] & (uint)auVar329._12_4_;
                            auVar282._0_8_ =
                                 CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                                 0x7f8000007f800000;
                            auVar282._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                            auVar282._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                            auVar282 = auVar282 | auVar258;
                            auVar301._4_4_ = auVar282._0_4_;
                            auVar301._0_4_ = auVar282._4_4_;
                            auVar301._8_4_ = auVar282._12_4_;
                            auVar301._12_4_ = auVar282._8_4_;
                            auVar241 = minps(auVar301,auVar282);
                            auVar259._0_8_ = auVar241._8_8_;
                            auVar259._8_4_ = auVar241._0_4_;
                            auVar259._12_4_ = auVar241._4_4_;
                            auVar241 = minps(auVar259,auVar241);
                            auVar260._0_8_ =
                                 CONCAT44(-(uint)(auVar241._4_4_ == auVar282._4_4_) &
                                          valid.field_0.i[1],
                                          -(uint)(auVar241._0_4_ == auVar282._0_4_) &
                                          valid.field_0.i[0]);
                            auVar260._8_4_ =
                                 -(uint)(auVar241._8_4_ == auVar282._8_4_) & valid.field_0.i[2];
                            auVar260._12_4_ =
                                 -(uint)(auVar241._12_4_ == auVar282._12_4_) & valid.field_0.i[3];
                            iVar160 = movmskps(iVar160,auVar260);
                            aVar219 = valid.field_0;
                            if (iVar160 != 0) {
                              aVar219.i[2] = auVar260._8_4_;
                              aVar219._0_8_ = auVar260._0_8_;
                              aVar219.i[3] = auVar260._12_4_;
                            }
                            uVar162 = movmskps(iVar160,(undefined1  [16])aVar219);
                            uVar172 = CONCAT44(uVar167,uVar162);
                            lVar178 = 0;
                            if (uVar172 != 0) {
                              for (; (uVar172 >> lVar178 & 1) == 0; lVar178 = lVar178 + 1) {
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_11e8 = local_11e8 & local_11e8 - 1;
            } while (local_11e8 != 0);
          }
          local_1208 = local_1208 + 1;
        } while (local_1208 != local_1210);
      }
      uVar161 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_10e8._4_4_ = uVar161;
      local_10e8._0_4_ = uVar161;
      local_10e8._8_4_ = uVar161;
      local_10e8._12_4_ = uVar161;
      uVar172 = local_1238;
      uVar174 = local_1218;
      uVar175 = local_1220;
      uVar177 = local_1230;
      uVar180 = local_1228;
      fVar332 = local_1268;
      fVar284 = fStack_1264;
      fVar359 = fStack_1260;
      fVar303 = fStack_125c;
      fVar343 = local_1278;
      fVar305 = fStack_1274;
      fVar368 = fStack_1270;
      fVar235 = fStack_126c;
      fVar344 = local_11d8;
      fVar338 = fStack_11d4;
      fVar339 = fStack_11d0;
      fVar340 = fStack_11cc;
    }
    if (local_1388 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }